

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  float *pfVar9;
  Primitive PVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  byte bVar70;
  uint uVar71;
  byte bVar72;
  uint uVar73;
  byte bVar74;
  long lVar75;
  long lVar76;
  bool bVar77;
  ulong uVar78;
  uint uVar135;
  uint uVar136;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar134 [32];
  uint uVar141;
  float fVar142;
  float fVar143;
  undefined4 uVar144;
  float fVar166;
  float fVar167;
  vint4 bi_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  vint4 bi_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  float fVar210;
  float fVar211;
  vint4 bi;
  float fVar212;
  undefined1 auVar207 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar235;
  vint4 ai_2;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar236;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  vint4 ai_1;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar242;
  undefined1 auVar241 [64];
  vint4 ai;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  undefined1 auVar247 [32];
  float fVar251;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [64];
  float fVar259;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar260 [64];
  float fVar265;
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar271;
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [64];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [64];
  undefined1 auVar279 [16];
  undefined1 auVar280 [64];
  undefined1 auVar281 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined8 local_900;
  undefined8 uStack_8f8;
  ulong local_8e8;
  ulong local_8e0;
  uint local_8d4;
  uint local_8d0;
  undefined4 local_8cc;
  float local_8c8;
  float local_8c4;
  undefined1 local_8c0 [32];
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [32];
  undefined1 local_840 [16];
  Primitive *local_830;
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  ulong local_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  RTCHitN local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 local_580 [16];
  uint local_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint uStack_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  float afStack_140 [2];
  uint auStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar130 [32];
  undefined1 auVar133 [32];
  undefined1 auVar121 [32];
  
  PVar10 = prim[1];
  uVar69 = (ulong)(byte)PVar10;
  lVar76 = uVar69 * 0x25;
  fVar142 = *(float *)(prim + lVar76 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar83 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + lVar76 + 6));
  auVar213._0_4_ = fVar142 * auVar83._0_4_;
  auVar213._4_4_ = fVar142 * auVar83._4_4_;
  auVar213._8_4_ = fVar142 * auVar83._8_4_;
  auVar213._12_4_ = fVar142 * auVar83._12_4_;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar145._0_4_ = fVar142 * auVar82._0_4_;
  auVar145._4_4_ = fVar142 * auVar82._4_4_;
  auVar145._8_4_ = fVar142 * auVar82._8_4_;
  auVar145._12_4_ = fVar142 * auVar82._12_4_;
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xf + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar69 + 6)));
  auVar227 = vcvtdq2ps_avx(auVar227);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1a + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1b + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x1c + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar237._4_4_ = auVar145._0_4_;
  auVar237._0_4_ = auVar145._0_4_;
  auVar237._8_4_ = auVar145._0_4_;
  auVar237._12_4_ = auVar145._0_4_;
  auVar88 = vshufps_avx(auVar145,auVar145,0x55);
  auVar89 = vshufps_avx(auVar145,auVar145,0xaa);
  fVar142 = auVar89._0_4_;
  auVar194._0_4_ = fVar142 * auVar85._0_4_;
  fVar259 = auVar89._4_4_;
  auVar194._4_4_ = fVar259 * auVar85._4_4_;
  fVar261 = auVar89._8_4_;
  auVar194._8_4_ = fVar261 * auVar85._8_4_;
  fVar262 = auVar89._12_4_;
  auVar194._12_4_ = fVar262 * auVar85._12_4_;
  auVar172._0_4_ = auVar227._0_4_ * fVar142;
  auVar172._4_4_ = auVar227._4_4_ * fVar259;
  auVar172._8_4_ = auVar227._8_4_ * fVar261;
  auVar172._12_4_ = auVar227._12_4_ * fVar262;
  auVar146._0_4_ = auVar87._0_4_ * fVar142;
  auVar146._4_4_ = auVar87._4_4_ * fVar259;
  auVar146._8_4_ = auVar87._8_4_ * fVar261;
  auVar146._12_4_ = auVar87._12_4_ * fVar262;
  auVar89 = vfmadd231ps_fma(auVar194,auVar88,auVar82);
  auVar30 = vfmadd231ps_fma(auVar172,auVar88,auVar86);
  auVar88 = vfmadd231ps_fma(auVar146,auVar84,auVar88);
  auVar31 = vfmadd231ps_fma(auVar89,auVar237,auVar83);
  auVar30 = vfmadd231ps_fma(auVar30,auVar237,auVar24);
  auVar32 = vfmadd231ps_fma(auVar88,auVar25,auVar237);
  auVar279._4_4_ = auVar213._0_4_;
  auVar279._0_4_ = auVar213._0_4_;
  auVar279._8_4_ = auVar213._0_4_;
  auVar279._12_4_ = auVar213._0_4_;
  auVar88 = vshufps_avx(auVar213,auVar213,0x55);
  auVar89 = vshufps_avx(auVar213,auVar213,0xaa);
  fVar142 = auVar89._0_4_;
  auVar238._0_4_ = fVar142 * auVar85._0_4_;
  fVar259 = auVar89._4_4_;
  auVar238._4_4_ = fVar259 * auVar85._4_4_;
  fVar261 = auVar89._8_4_;
  auVar238._8_4_ = fVar261 * auVar85._8_4_;
  fVar262 = auVar89._12_4_;
  auVar238._12_4_ = fVar262 * auVar85._12_4_;
  auVar224._0_4_ = auVar227._0_4_ * fVar142;
  auVar224._4_4_ = auVar227._4_4_ * fVar259;
  auVar224._8_4_ = auVar227._8_4_ * fVar261;
  auVar224._12_4_ = auVar227._12_4_ * fVar262;
  auVar214._0_4_ = auVar87._0_4_ * fVar142;
  auVar214._4_4_ = auVar87._4_4_ * fVar259;
  auVar214._8_4_ = auVar87._8_4_ * fVar261;
  auVar214._12_4_ = auVar87._12_4_ * fVar262;
  auVar82 = vfmadd231ps_fma(auVar238,auVar88,auVar82);
  auVar85 = vfmadd231ps_fma(auVar224,auVar88,auVar86);
  auVar86 = vfmadd231ps_fma(auVar214,auVar88,auVar84);
  auVar33 = vfmadd231ps_fma(auVar82,auVar279,auVar83);
  auVar145 = vfmadd231ps_fma(auVar85,auVar279,auVar24);
  auVar256._8_4_ = 0x7fffffff;
  auVar256._0_8_ = 0x7fffffff7fffffff;
  auVar256._12_4_ = 0x7fffffff;
  auVar146 = vfmadd231ps_fma(auVar86,auVar279,auVar25);
  auVar83 = vandps_avx(auVar256,auVar31);
  auVar252._8_4_ = 0x219392ef;
  auVar252._0_8_ = 0x219392ef219392ef;
  auVar252._12_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar83,auVar252,1);
  bVar17 = (bool)((byte)uVar78 & 1);
  auVar79._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._0_4_;
  bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._4_4_;
  bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._8_4_;
  bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar31._12_4_;
  auVar83 = vandps_avx(auVar256,auVar30);
  uVar78 = vcmpps_avx512vl(auVar83,auVar252,1);
  bVar17 = (bool)((byte)uVar78 & 1);
  auVar80._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar30._0_4_;
  bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar30._4_4_;
  bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar30._8_4_;
  bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar30._12_4_;
  auVar83 = vandps_avx(auVar256,auVar32);
  uVar78 = vcmpps_avx512vl(auVar83,auVar252,1);
  bVar17 = (bool)((byte)uVar78 & 1);
  auVar81._0_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar32._0_4_;
  bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar32._4_4_;
  bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar32._8_4_;
  bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar17 * 0x219392ef | (uint)!bVar17 * auVar32._12_4_;
  auVar82 = vrcp14ps_avx512vl(auVar79);
  auVar253._8_4_ = 0x3f800000;
  auVar253._0_8_ = &DAT_3f8000003f800000;
  auVar253._12_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar79,auVar82,auVar253);
  auVar31 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar80);
  auVar83 = vfnmadd213ps_fma(auVar80,auVar82,auVar253);
  auVar32 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  auVar82 = vrcp14ps_avx512vl(auVar81);
  auVar83 = vfnmadd213ps_fma(auVar81,auVar82,auVar253);
  auVar29 = vfmadd132ps_fma(auVar83,auVar82,auVar82);
  fVar142 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar76 + 0x16)) *
            *(float *)(prim + lVar76 + 0x1a);
  auVar243._4_4_ = fVar142;
  auVar243._0_4_ = fVar142;
  auVar243._8_4_ = fVar142;
  auVar243._12_4_ = fVar142;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar24 = vsubps_avx(auVar82,auVar83);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar82 = vpmovsxwd_avx(auVar85);
  auVar85 = vfmadd213ps_fma(auVar24,auVar243,auVar83);
  auVar83 = vcvtdq2ps_avx(auVar82);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar82 = vpmovsxwd_avx(auVar24);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar24 = vfmadd213ps_fma(auVar82,auVar243,auVar83);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar83 = vpmovsxwd_avx(auVar86);
  auVar83 = vcvtdq2ps_avx(auVar83);
  uVar78 = (ulong)(uint)((int)(uVar69 * 5) << 2);
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar69 * 2 + uVar78 + 6);
  auVar82 = vpmovsxwd_avx(auVar227);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar86 = vfmadd213ps_fma(auVar82,auVar243,auVar83);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar83 = vpmovsxwd_avx(auVar25);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar69 * 0x18 + 6);
  auVar82 = vpmovsxwd_avx(auVar84);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar227 = vfmadd213ps_fma(auVar82,auVar243,auVar83);
  auVar270 = ZEXT1664(auVar227);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar69 * 0x1d + 6);
  auVar83 = vpmovsxwd_avx(auVar87);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar69 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar82 = vpmovsxwd_avx(auVar88);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar25 = vfmadd213ps_fma(auVar82,auVar243,auVar83);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar69) + 6);
  auVar83 = vpmovsxwd_avx(auVar89);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar69 * 0x23 + 6);
  auVar82 = vpmovsxwd_avx(auVar30);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar82 = vsubps_avx(auVar82,auVar83);
  auVar82 = vfmadd213ps_fma(auVar82,auVar243,auVar83);
  auVar83 = vsubps_avx(auVar85,auVar33);
  auVar244._0_4_ = auVar31._0_4_ * auVar83._0_4_;
  auVar244._4_4_ = auVar31._4_4_ * auVar83._4_4_;
  auVar244._8_4_ = auVar31._8_4_ * auVar83._8_4_;
  auVar244._12_4_ = auVar31._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar24,auVar33);
  auVar195._0_4_ = auVar31._0_4_ * auVar83._0_4_;
  auVar195._4_4_ = auVar31._4_4_ * auVar83._4_4_;
  auVar195._8_4_ = auVar31._8_4_ * auVar83._8_4_;
  auVar195._12_4_ = auVar31._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar86,auVar145);
  auVar239._0_4_ = auVar32._0_4_ * auVar83._0_4_;
  auVar239._4_4_ = auVar32._4_4_ * auVar83._4_4_;
  auVar239._8_4_ = auVar32._8_4_ * auVar83._8_4_;
  auVar239._12_4_ = auVar32._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar227,auVar145);
  auVar173._0_4_ = auVar32._0_4_ * auVar83._0_4_;
  auVar173._4_4_ = auVar32._4_4_ * auVar83._4_4_;
  auVar173._8_4_ = auVar32._8_4_ * auVar83._8_4_;
  auVar173._12_4_ = auVar32._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar25,auVar146);
  auVar225._0_4_ = auVar29._0_4_ * auVar83._0_4_;
  auVar225._4_4_ = auVar29._4_4_ * auVar83._4_4_;
  auVar225._8_4_ = auVar29._8_4_ * auVar83._8_4_;
  auVar225._12_4_ = auVar29._12_4_ * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar82,auVar146);
  auVar147._0_4_ = auVar29._0_4_ * auVar83._0_4_;
  auVar147._4_4_ = auVar29._4_4_ * auVar83._4_4_;
  auVar147._8_4_ = auVar29._8_4_ * auVar83._8_4_;
  auVar147._12_4_ = auVar29._12_4_ * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar244,auVar195);
  auVar82 = vpminsd_avx(auVar239,auVar173);
  auVar83 = vmaxps_avx(auVar83,auVar82);
  auVar82 = vpminsd_avx(auVar225,auVar147);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar31._4_4_ = uVar144;
  auVar31._0_4_ = uVar144;
  auVar31._8_4_ = uVar144;
  auVar31._12_4_ = uVar144;
  auVar82 = vmaxps_avx512vl(auVar82,auVar31);
  auVar83 = vmaxps_avx(auVar83,auVar82);
  auVar32._8_4_ = 0x3f7ffffa;
  auVar32._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar32._12_4_ = 0x3f7ffffa;
  local_4b0 = vmulps_avx512vl(auVar83,auVar32);
  auVar83 = vpmaxsd_avx(auVar244,auVar195);
  auVar82 = vpmaxsd_avx(auVar239,auVar173);
  auVar83 = vminps_avx(auVar83,auVar82);
  auVar82 = vpmaxsd_avx(auVar225,auVar147);
  uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar29._4_4_ = uVar144;
  auVar29._0_4_ = uVar144;
  auVar29._8_4_ = uVar144;
  auVar29._12_4_ = uVar144;
  auVar82 = vminps_avx512vl(auVar82,auVar29);
  auVar83 = vminps_avx(auVar83,auVar82);
  auVar33._8_4_ = 0x3f800003;
  auVar33._0_8_ = 0x3f8000033f800003;
  auVar33._12_4_ = 0x3f800003;
  auVar83 = vmulps_avx512vl(auVar83,auVar33);
  auVar82 = vpbroadcastd_avx512vl();
  uVar26 = vcmpps_avx512vl(local_4b0,auVar83,2);
  local_688 = vpcmpgtd_avx512vl(auVar82,_DAT_01ff0cf0);
  local_688 = ((byte)uVar26 & 0xf) & local_688;
  if ((char)local_688 == '\0') {
    return;
  }
  local_610 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                CONCAT424(0x7fffffff,
                                          CONCAT420(0x7fffffff,
                                                    CONCAT416(0x7fffffff,
                                                              CONCAT412(0x7fffffff,
                                                                        CONCAT48(0x7fffffff,
                                                                                 0x7fffffff7fffffff)
                                                                       ))))));
  auVar260 = ZEXT3264(_DAT_02020f20);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar281 = ZEXT3264(auVar90);
  local_830 = prim;
LAB_01c32c27:
  lVar76 = 0;
  for (uVar78 = local_688; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar76 = lVar76 + 1;
  }
  uVar71 = *(uint *)(prim + 2);
  local_8e0 = (ulong)*(uint *)(prim + lVar76 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar71].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           local_8e0 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar142 = (pGVar12->time_range).lower;
  fVar142 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar142) / ((pGVar12->time_range).upper - fVar142));
  auVar83 = vroundss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),9);
  auVar83 = vminss_avx(auVar83,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar83 = vmaxss_avx(ZEXT816(0) << 0x20,auVar83);
  fVar142 = fVar142 - auVar83._0_4_;
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar75 = (long)(int)auVar83._0_4_ * 0x38;
  lVar76 = *(long *)(_Var13 + 0x10 + lVar75);
  lVar14 = *(long *)(_Var13 + 0x38 + lVar75);
  lVar15 = *(long *)(_Var13 + 0x48 + lVar75);
  pfVar9 = (float *)(lVar14 + uVar78 * lVar15);
  auVar196._0_4_ = fVar142 * *pfVar9;
  auVar196._4_4_ = fVar142 * pfVar9[1];
  auVar196._8_4_ = fVar142 * pfVar9[2];
  auVar196._12_4_ = fVar142 * pfVar9[3];
  pfVar9 = (float *)(lVar14 + (uVar78 + 1) * lVar15);
  auVar215._0_4_ = fVar142 * *pfVar9;
  auVar215._4_4_ = fVar142 * pfVar9[1];
  auVar215._8_4_ = fVar142 * pfVar9[2];
  auVar215._12_4_ = fVar142 * pfVar9[3];
  pfVar9 = (float *)(lVar14 + (uVar78 + 2) * lVar15);
  auVar226._0_4_ = fVar142 * *pfVar9;
  auVar226._4_4_ = fVar142 * pfVar9[1];
  auVar226._8_4_ = fVar142 * pfVar9[2];
  auVar226._12_4_ = fVar142 * pfVar9[3];
  pfVar9 = (float *)(lVar14 + lVar15 * (uVar78 + 3));
  auVar174._0_4_ = fVar142 * *pfVar9;
  auVar174._4_4_ = fVar142 * pfVar9[1];
  auVar174._8_4_ = fVar142 * pfVar9[2];
  auVar174._12_4_ = fVar142 * pfVar9[3];
  lVar14 = *(long *)(_Var13 + lVar75);
  fVar142 = 1.0 - fVar142;
  auVar148._4_4_ = fVar142;
  auVar148._0_4_ = fVar142;
  auVar148._8_4_ = fVar142;
  auVar148._12_4_ = fVar142;
  auVar85 = vfmadd231ps_fma(auVar196,auVar148,*(undefined1 (*) [16])(lVar14 + lVar76 * uVar78));
  auVar24 = vfmadd231ps_fma(auVar215,auVar148,*(undefined1 (*) [16])(lVar14 + lVar76 * (uVar78 + 1))
                           );
  auVar86 = vfmadd231ps_fma(auVar226,auVar148,*(undefined1 (*) [16])(lVar14 + lVar76 * (uVar78 + 2))
                           );
  auVar227 = vfmadd231ps_fma(auVar174,auVar148,
                             *(undefined1 (*) [16])(lVar14 + lVar76 * (uVar78 + 3)));
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar82 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_800 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar283 = ZEXT3264(local_800);
  local_8c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar282 = ZEXT3264(local_8c0);
  auVar83 = vunpcklps_avx512vl(local_800._0_16_,local_8c0._0_16_);
  local_820 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar280 = ZEXT3264(local_820);
  auVar88 = local_820._0_16_;
  local_790 = vinsertps_avx512f(auVar83,auVar88,0x28);
  auVar274 = ZEXT1664(local_790);
  auVar240._0_4_ = auVar85._0_4_ + auVar24._0_4_ + auVar86._0_4_ + auVar227._0_4_;
  auVar240._4_4_ = auVar85._4_4_ + auVar24._4_4_ + auVar86._4_4_ + auVar227._4_4_;
  auVar240._8_4_ = auVar85._8_4_ + auVar24._8_4_ + auVar86._8_4_ + auVar227._8_4_;
  auVar240._12_4_ = auVar85._12_4_ + auVar24._12_4_ + auVar86._12_4_ + auVar227._12_4_;
  auVar34._8_4_ = 0x3e800000;
  auVar34._0_8_ = 0x3e8000003e800000;
  auVar34._12_4_ = 0x3e800000;
  auVar83 = vmulps_avx512vl(auVar240,auVar34);
  auVar83 = vsubps_avx(auVar83,auVar82);
  auVar83 = vdpps_avx(auVar83,local_790,0x7f);
  fVar142 = *(float *)(ray + k * 4 + 0x30);
  auVar278 = ZEXT464((uint)fVar142);
  local_7a0 = vdpps_avx(local_790,local_790,0x7f);
  auVar87 = ZEXT816(0) << 0x40;
  auVar266 = ZEXT1664(auVar87);
  auVar245._4_12_ = ZEXT812(0) << 0x20;
  auVar245._0_4_ = local_7a0._0_4_;
  auVar84 = vrcp14ss_avx512f(auVar87,auVar245);
  auVar25 = vfnmadd213ss_fma(auVar84,local_7a0,ZEXT416(0x40000000));
  local_400 = auVar83._0_4_ * auVar84._0_4_ * auVar25._0_4_;
  auVar241 = ZEXT464((uint)local_400);
  auVar246._4_4_ = local_400;
  auVar246._0_4_ = local_400;
  auVar246._8_4_ = local_400;
  auVar246._12_4_ = local_400;
  fStack_650 = local_400;
  _local_660 = auVar246;
  fStack_64c = local_400;
  fStack_648 = local_400;
  fStack_644 = local_400;
  auVar83 = vfmadd231ps_fma(auVar82,local_790,auVar246);
  auVar83 = vblendps_avx(auVar83,auVar87,8);
  auVar82 = vsubps_avx(auVar85,auVar83);
  auVar85 = vsubps_avx(auVar86,auVar83);
  auVar24 = vsubps_avx(auVar24,auVar83);
  auVar83 = vsubps_avx(auVar227,auVar83);
  local_1e0 = auVar82._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar90._8_4_ = 1;
  auVar90._0_8_ = 0x100000001;
  auVar90._12_4_ = 1;
  auVar90._16_4_ = 1;
  auVar90._20_4_ = 1;
  auVar90._24_4_ = 1;
  auVar90._28_4_ = 1;
  local_720 = ZEXT1632(auVar82);
  local_200 = vpermps_avx2(auVar90,local_720);
  auVar91._8_4_ = 2;
  auVar91._0_8_ = 0x200000002;
  auVar91._12_4_ = 2;
  auVar91._16_4_ = 2;
  auVar91._20_4_ = 2;
  auVar91._24_4_ = 2;
  auVar91._28_4_ = 2;
  local_220 = vpermps_avx2(auVar91,local_720);
  auVar92._8_4_ = 3;
  auVar92._0_8_ = 0x300000003;
  auVar92._12_4_ = 3;
  auVar92._16_4_ = 3;
  auVar92._20_4_ = 3;
  auVar92._24_4_ = 3;
  auVar92._28_4_ = 3;
  local_240 = vpermps_avx2(auVar92,local_720);
  local_260 = auVar24._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_760 = ZEXT1632(auVar24);
  local_280 = vpermps_avx2(auVar90,local_760);
  local_2a0 = vpermps_avx2(auVar91,local_760);
  local_2c0 = vpermps_avx2(auVar92,local_760);
  local_2e0 = auVar85._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_740 = ZEXT1632(auVar85);
  local_300 = vpermps_avx2(auVar90,local_740);
  local_320 = vpermps_avx2(auVar91,local_740);
  local_340 = vpermps_avx2(auVar92,local_740);
  local_360 = auVar83._0_4_;
  uStack_35c = local_360;
  uStack_358 = local_360;
  uStack_354 = local_360;
  uStack_350 = local_360;
  uStack_34c = local_360;
  uStack_348 = local_360;
  uStack_344 = local_360;
  _local_780 = ZEXT1632(auVar83);
  local_380 = vpermps_avx2(auVar90,_local_780);
  local_3a0 = vpermps_avx2(auVar91,_local_780);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  _local_3c0 = vpermps_avx2(auVar92,_local_780);
  auVar83 = vmulss_avx512f(auVar88,auVar88);
  auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),local_8c0,local_8c0);
  auVar90 = vfmadd231ps_avx512vl(auVar90,local_800,local_800);
  local_3e0._0_4_ = auVar90._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  local_480 = vandps_avx(auVar258._0_32_,local_3e0);
  local_6f0 = ZEXT416((uint)local_400);
  local_400 = fVar142 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_5f0 = vpbroadcastd_avx512vl();
  local_8e8 = 0;
  local_828 = 1;
  local_600 = vpbroadcastd_avx512vl();
  auVar83 = vsqrtss_avx(local_7a0,local_7a0);
  local_8c4 = auVar83._0_4_;
  auVar83 = vsqrtss_avx(local_7a0,local_7a0);
  local_8c8 = auVar83._0_4_;
  auVar209 = ZEXT1664(ZEXT816(0x3f80000000000000));
  do {
    local_840 = auVar209._0_16_;
    auVar83 = vmovshdup_avx(local_840);
    fVar259 = auVar209._0_4_;
    fVar271 = auVar83._0_4_ - fVar259;
    fVar250 = fVar271 * 0.04761905;
    auVar232._4_4_ = fVar259;
    auVar232._0_4_ = fVar259;
    auVar232._8_4_ = fVar259;
    auVar232._12_4_ = fVar259;
    auVar232._16_4_ = fVar259;
    auVar232._20_4_ = fVar259;
    auVar232._24_4_ = fVar259;
    auVar232._28_4_ = fVar259;
    local_7c0._4_4_ = fVar271;
    local_7c0._0_4_ = fVar271;
    local_7c0._8_4_ = fVar271;
    local_7c0._12_4_ = fVar271;
    local_7c0._16_4_ = fVar271;
    local_7c0._20_4_ = fVar271;
    local_7c0._24_4_ = fVar271;
    local_7c0._28_4_ = fVar271;
    auVar83 = vfmadd231ps_fma(auVar232,local_7c0,auVar260._0_32_);
    auVar92 = vsubps_avx512vl(auVar281._0_32_,ZEXT1632(auVar83));
    fVar259 = auVar92._0_4_;
    fVar262 = auVar92._4_4_;
    fVar248 = auVar92._8_4_;
    fVar264 = auVar92._12_4_;
    fVar251 = auVar92._16_4_;
    fVar236 = auVar92._20_4_;
    fVar265 = auVar92._24_4_;
    fVar143 = fVar259 * fVar259 * fVar259;
    fVar166 = fVar262 * fVar262 * fVar262;
    fVar167 = fVar248 * fVar248 * fVar248;
    fVar168 = fVar264 * fVar264 * fVar264;
    fVar169 = fVar251 * fVar251 * fVar251;
    fVar170 = fVar236 * fVar236 * fVar236;
    fVar171 = fVar265 * fVar265 * fVar265;
    fVar261 = auVar83._0_4_;
    fVar263 = auVar83._4_4_;
    fVar249 = auVar83._8_4_;
    fVar235 = auVar83._12_4_;
    fVar193 = fVar261 * fVar261 * fVar261;
    fVar210 = fVar263 * fVar263 * fVar263;
    fVar211 = fVar249 * fVar249 * fVar249;
    fVar212 = fVar235 * fVar235 * fVar235;
    auVar281._0_4_ = fVar261 * fVar259;
    auVar281._4_4_ = fVar263 * fVar262;
    auVar281._8_4_ = fVar249 * fVar248;
    auVar281._12_4_ = fVar235 * fVar264;
    auVar281._16_4_ = fVar251 * 0.0;
    auVar281._20_4_ = fVar236 * 0.0;
    auVar281._28_36_ = auVar266._28_36_;
    auVar281._24_4_ = fVar265 * 0.0;
    fVar271 = auVar270._28_4_ + auVar278._28_4_ + fVar271;
    fVar242 = fVar271 + auVar274._28_4_ + auVar241._28_4_;
    auVar96._4_4_ = fVar166 * 0.16666667;
    auVar96._0_4_ = fVar143 * 0.16666667;
    auVar96._8_4_ = fVar167 * 0.16666667;
    auVar96._12_4_ = fVar168 * 0.16666667;
    auVar96._16_4_ = fVar169 * 0.16666667;
    auVar96._20_4_ = fVar170 * 0.16666667;
    auVar96._24_4_ = fVar171 * 0.16666667;
    auVar96._28_4_ = fVar271;
    auVar97._4_4_ =
         (auVar281._4_4_ * fVar262 * 12.0 + auVar281._4_4_ * fVar263 * 6.0 + fVar210 + fVar166 * 4.0
         ) * 0.16666667;
    auVar97._0_4_ =
         (auVar281._0_4_ * fVar259 * 12.0 + auVar281._0_4_ * fVar261 * 6.0 + fVar193 + fVar143 * 4.0
         ) * 0.16666667;
    auVar97._8_4_ =
         (auVar281._8_4_ * fVar248 * 12.0 + auVar281._8_4_ * fVar249 * 6.0 + fVar211 + fVar167 * 4.0
         ) * 0.16666667;
    auVar97._12_4_ =
         (auVar281._12_4_ * fVar264 * 12.0 + auVar281._12_4_ * fVar235 * 6.0 +
         fVar212 + fVar168 * 4.0) * 0.16666667;
    auVar97._16_4_ =
         (auVar281._16_4_ * fVar251 * 12.0 + auVar281._16_4_ * 0.0 * 6.0 + fVar169 * 4.0 + 0.0) *
         0.16666667;
    auVar97._20_4_ =
         (auVar281._20_4_ * fVar236 * 12.0 + auVar281._20_4_ * 0.0 * 6.0 + fVar170 * 4.0 + 0.0) *
         0.16666667;
    auVar97._24_4_ =
         (auVar281._24_4_ * fVar265 * 12.0 + auVar281._24_4_ * 0.0 * 6.0 + fVar171 * 4.0 + 0.0) *
         0.16666667;
    auVar97._28_4_ = auVar274._28_4_;
    auVar98._4_4_ =
         (fVar210 * 4.0 + fVar166 + auVar281._4_4_ * fVar263 * 12.0 + auVar281._4_4_ * fVar262 * 6.0
         ) * 0.16666667;
    auVar98._0_4_ =
         (fVar193 * 4.0 + fVar143 + auVar281._0_4_ * fVar261 * 12.0 + auVar281._0_4_ * fVar259 * 6.0
         ) * 0.16666667;
    auVar98._8_4_ =
         (fVar211 * 4.0 + fVar167 + auVar281._8_4_ * fVar249 * 12.0 + auVar281._8_4_ * fVar248 * 6.0
         ) * 0.16666667;
    auVar98._12_4_ =
         (fVar212 * 4.0 + fVar168 +
         auVar281._12_4_ * fVar235 * 12.0 + auVar281._12_4_ * fVar264 * 6.0) * 0.16666667;
    auVar98._16_4_ =
         (fVar169 + 0.0 + auVar281._16_4_ * 0.0 * 12.0 + auVar281._16_4_ * fVar251 * 6.0) *
         0.16666667;
    auVar98._20_4_ =
         (fVar170 + 0.0 + auVar281._20_4_ * 0.0 * 12.0 + auVar281._20_4_ * fVar236 * 6.0) *
         0.16666667;
    auVar98._24_4_ =
         (fVar171 + 0.0 + auVar281._24_4_ * 0.0 * 12.0 + auVar281._24_4_ * fVar265 * 6.0) *
         0.16666667;
    auVar98._28_4_ = auVar278._28_4_;
    auVar99._28_4_ = fVar242;
    auVar99._0_28_ =
         ZEXT1628(CONCAT412(fVar212 * 0.16666667,
                            CONCAT48(fVar211 * 0.16666667,
                                     CONCAT44(fVar210 * 0.16666667,fVar193 * 0.16666667))));
    auVar207._4_4_ = uStack_35c;
    auVar207._0_4_ = local_360;
    auVar207._8_4_ = uStack_358;
    auVar207._12_4_ = uStack_354;
    auVar207._16_4_ = uStack_350;
    auVar207._20_4_ = uStack_34c;
    auVar207._24_4_ = uStack_348;
    auVar207._28_4_ = uStack_344;
    auVar90 = vmulps_avx512vl(auVar207,auVar99);
    auVar93 = vmulps_avx512vl(local_380,auVar99);
    auVar94 = vmulps_avx512vl(local_3a0,auVar99);
    auVar100._4_4_ = (float)local_3c0._4_4_ * fVar210 * 0.16666667;
    auVar100._0_4_ = (float)local_3c0._0_4_ * fVar193 * 0.16666667;
    auVar100._8_4_ = fStack_3b8 * fVar211 * 0.16666667;
    auVar100._12_4_ = fStack_3b4 * fVar212 * 0.16666667;
    auVar100._16_4_ = fStack_3b0 * 0.0;
    auVar100._20_4_ = fStack_3ac * 0.0;
    auVar100._24_4_ = fStack_3a8 * 0.0;
    auVar100._28_4_ = fVar242;
    auVar114._4_4_ = uStack_2dc;
    auVar114._0_4_ = local_2e0;
    auVar114._8_4_ = uStack_2d8;
    auVar114._12_4_ = uStack_2d4;
    auVar114._16_4_ = uStack_2d0;
    auVar114._20_4_ = uStack_2cc;
    auVar114._24_4_ = uStack_2c8;
    auVar114._28_4_ = uStack_2c4;
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,auVar114);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_300);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,local_320);
    auVar95 = vfmadd231ps_avx512vl(auVar100,local_340,auVar98);
    auVar118._4_4_ = uStack_25c;
    auVar118._0_4_ = local_260;
    auVar118._8_4_ = uStack_258;
    auVar118._12_4_ = uStack_254;
    auVar118._16_4_ = uStack_250;
    auVar118._20_4_ = uStack_24c;
    auVar118._24_4_ = uStack_248;
    auVar118._28_4_ = uStack_244;
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,auVar118);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,local_280);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar97,local_2a0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,local_2c0,auVar97);
    auVar119._4_4_ = uStack_1dc;
    auVar119._0_4_ = local_1e0;
    auVar119._8_4_ = uStack_1d8;
    auVar119._12_4_ = uStack_1d4;
    auVar119._16_4_ = uStack_1d0;
    auVar119._20_4_ = uStack_1cc;
    auVar119._24_4_ = uStack_1c8;
    auVar119._28_4_ = uStack_1c4;
    auVar82 = vfmadd231ps_fma(auVar90,auVar96,auVar119);
    auVar85 = vfmadd231ps_fma(auVar93,auVar96,local_200);
    auVar24 = vfmadd231ps_fma(auVar94,auVar96,local_220);
    auVar94 = vfmadd231ps_avx512vl(auVar95,local_240,auVar96);
    auVar95 = vxorps_avx512vl(auVar92,auVar91);
    auVar91 = vxorps_avx512vl(ZEXT1632(auVar83),auVar91);
    auVar120._0_4_ = auVar91._0_4_ * fVar261;
    auVar120._4_4_ = auVar91._4_4_ * fVar263;
    auVar120._8_4_ = auVar91._8_4_ * fVar249;
    auVar120._12_4_ = auVar91._12_4_ * fVar235;
    auVar120._16_4_ = auVar91._16_4_ * 0.0;
    auVar120._20_4_ = auVar91._20_4_ * 0.0;
    auVar120._24_4_ = auVar91._24_4_ * 0.0;
    auVar120._28_4_ = 0;
    auVar93._8_4_ = 0x40800000;
    auVar93._0_8_ = 0x4080000040800000;
    auVar93._12_4_ = 0x40800000;
    auVar93._16_4_ = 0x40800000;
    auVar93._20_4_ = 0x40800000;
    auVar93._24_4_ = 0x40800000;
    auVar93._28_4_ = 0x40800000;
    auVar93 = vmulps_avx512vl(auVar281._0_32_,auVar93);
    auVar90 = vsubps_avx(auVar120,auVar93);
    auVar101._4_4_ = auVar95._4_4_ * fVar262 * 0.5;
    auVar101._0_4_ = auVar95._0_4_ * fVar259 * 0.5;
    auVar101._8_4_ = auVar95._8_4_ * fVar248 * 0.5;
    auVar101._12_4_ = auVar95._12_4_ * fVar264 * 0.5;
    auVar101._16_4_ = auVar95._16_4_ * fVar251 * 0.5;
    auVar101._20_4_ = auVar95._20_4_ * fVar236 * 0.5;
    auVar101._24_4_ = auVar95._24_4_ * fVar265 * 0.5;
    auVar101._28_4_ = auVar92._28_4_;
    auVar106._4_4_ = auVar90._4_4_ * 0.5;
    auVar106._0_4_ = auVar90._0_4_ * 0.5;
    auVar106._8_4_ = auVar90._8_4_ * 0.5;
    auVar106._12_4_ = auVar90._12_4_ * 0.5;
    auVar106._16_4_ = auVar90._16_4_ * 0.5;
    auVar106._20_4_ = auVar90._20_4_ * 0.5;
    auVar106._24_4_ = auVar90._24_4_ * 0.5;
    auVar106._28_4_ = auVar90._28_4_;
    auVar107._4_4_ = (fVar262 * fVar262 + auVar93._4_4_) * 0.5;
    auVar107._0_4_ = (fVar259 * fVar259 + auVar93._0_4_) * 0.5;
    auVar107._8_4_ = (fVar248 * fVar248 + auVar93._8_4_) * 0.5;
    auVar107._12_4_ = (fVar264 * fVar264 + auVar93._12_4_) * 0.5;
    auVar107._16_4_ = (fVar251 * fVar251 + auVar93._16_4_) * 0.5;
    auVar107._20_4_ = (fVar236 * fVar236 + auVar93._20_4_) * 0.5;
    auVar107._24_4_ = (fVar265 * fVar265 + auVar93._24_4_) * 0.5;
    auVar107._28_4_ = auVar258._28_4_ + auVar93._28_4_;
    fVar259 = fVar261 * fVar261 * 0.5;
    fVar261 = fVar263 * fVar263 * 0.5;
    fVar262 = fVar249 * fVar249 * 0.5;
    fVar263 = fVar235 * fVar235 * 0.5;
    auVar108._28_4_ = auVar260._28_4_;
    auVar108._0_28_ = ZEXT1628(CONCAT412(fVar263,CONCAT48(fVar262,CONCAT44(fVar261,fVar259))));
    auVar90 = vmulps_avx512vl(auVar207,auVar108);
    auVar92 = vmulps_avx512vl(local_380,auVar108);
    auVar93 = vmulps_avx512vl(local_3a0,auVar108);
    auVar109._4_4_ = fVar261 * (float)local_3c0._4_4_;
    auVar109._0_4_ = fVar259 * (float)local_3c0._0_4_;
    auVar109._8_4_ = fVar262 * fStack_3b8;
    auVar109._12_4_ = fVar263 * fStack_3b4;
    auVar109._16_4_ = fStack_3b0 * 0.0;
    auVar109._20_4_ = fStack_3ac * 0.0;
    auVar109._24_4_ = fStack_3a8 * 0.0;
    auVar109._28_4_ = auVar260._28_4_;
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar107,auVar114);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar107,local_300);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar107,local_320);
    auVar95 = vfmadd231ps_avx512vl(auVar109,local_340,auVar107);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar106,auVar118);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar106,local_280);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar106,local_2a0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,local_2c0,auVar106);
    auVar83 = vfmadd231ps_fma(auVar90,auVar101,auVar119);
    auVar86 = vfmadd231ps_fma(auVar92,auVar101,local_200);
    auVar227 = vfmadd231ps_fma(auVar93,auVar101,local_220);
    auVar90 = vfmadd231ps_avx512vl(auVar95,local_240,auVar101);
    auVar117._4_4_ = auVar83._4_4_ * fVar250;
    auVar117._0_4_ = auVar83._0_4_ * fVar250;
    auVar117._8_4_ = auVar83._8_4_ * fVar250;
    auVar117._12_4_ = auVar83._12_4_ * fVar250;
    auVar117._16_4_ = fVar250 * 0.0;
    auVar117._20_4_ = fVar250 * 0.0;
    auVar117._24_4_ = fVar250 * 0.0;
    auVar117._28_4_ = auVar91._28_4_;
    auVar270 = ZEXT3264(auVar117);
    auVar272._0_4_ = auVar86._0_4_ * fVar250;
    auVar272._4_4_ = auVar86._4_4_ * fVar250;
    auVar272._8_4_ = auVar86._8_4_ * fVar250;
    auVar272._12_4_ = auVar86._12_4_ * fVar250;
    auVar272._16_4_ = fVar250 * 0.0;
    auVar272._20_4_ = fVar250 * 0.0;
    auVar272._24_4_ = fVar250 * 0.0;
    auVar272._28_4_ = 0;
    auVar274 = ZEXT3264(auVar272);
    auVar277._0_4_ = auVar227._0_4_ * fVar250;
    auVar277._4_4_ = auVar227._4_4_ * fVar250;
    auVar277._8_4_ = auVar227._8_4_ * fVar250;
    auVar277._12_4_ = auVar227._12_4_ * fVar250;
    auVar277._16_4_ = fVar250 * 0.0;
    auVar277._20_4_ = fVar250 * 0.0;
    auVar277._24_4_ = fVar250 * 0.0;
    auVar277._28_4_ = 0;
    auVar278 = ZEXT3264(auVar277);
    fVar259 = auVar90._0_4_ * fVar250;
    fVar261 = auVar90._4_4_ * fVar250;
    auVar110._4_4_ = fVar261;
    auVar110._0_4_ = fVar259;
    fVar262 = auVar90._8_4_ * fVar250;
    auVar110._8_4_ = fVar262;
    fVar263 = auVar90._12_4_ * fVar250;
    auVar110._12_4_ = fVar263;
    fVar248 = auVar90._16_4_ * fVar250;
    auVar110._16_4_ = fVar248;
    fVar249 = auVar90._20_4_ * fVar250;
    auVar110._20_4_ = fVar249;
    fVar250 = auVar90._24_4_ * fVar250;
    auVar110._24_4_ = fVar250;
    auVar110._28_4_ = fStack_3a4;
    auVar83 = vxorps_avx512vl(local_3a0._0_16_,local_3a0._0_16_);
    auVar96 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_0205fd20,ZEXT1632(auVar83));
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar85),_DAT_0205fd20,ZEXT1632(auVar83));
    auVar92 = ZEXT1632(auVar83);
    auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar24),_DAT_0205fd20,auVar92);
    auVar266 = ZEXT3264(auVar98);
    auVar121._0_4_ = fVar259 + auVar94._0_4_;
    auVar121._4_4_ = fVar261 + auVar94._4_4_;
    auVar121._8_4_ = fVar262 + auVar94._8_4_;
    auVar121._12_4_ = fVar263 + auVar94._12_4_;
    auVar121._16_4_ = fVar248 + auVar94._16_4_;
    auVar121._20_4_ = fVar249 + auVar94._20_4_;
    auVar121._24_4_ = fVar250 + auVar94._24_4_;
    auVar121._28_4_ = fStack_3a4 + auVar94._28_4_;
    auVar90 = vmaxps_avx(auVar94,auVar121);
    auVar91 = vminps_avx(auVar94,auVar121);
    auVar95 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,auVar92);
    auVar99 = vpermt2ps_avx512vl(auVar117,_DAT_0205fd20,auVar92);
    auVar100 = vpermt2ps_avx512vl(auVar272,_DAT_0205fd20,auVar92);
    auVar108 = ZEXT1632(auVar83);
    auVar101 = vpermt2ps_avx512vl(auVar277,_DAT_0205fd20,auVar108);
    auVar241 = ZEXT3264(auVar101);
    auVar92 = vpermt2ps_avx512vl(auVar110,_DAT_0205fd20,auVar108);
    auVar102 = vsubps_avx512vl(auVar95,auVar92);
    auVar92 = vsubps_avx(auVar96,ZEXT1632(auVar82));
    auVar93 = vsubps_avx(auVar97,ZEXT1632(auVar85));
    local_640 = vsubps_avx512vl(auVar98,ZEXT1632(auVar24));
    auVar94 = vmulps_avx512vl(auVar93,auVar277);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar272,local_640);
    auVar103 = vmulps_avx512vl(local_640,auVar117);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar277,auVar92);
    auVar104 = vmulps_avx512vl(auVar92,auVar272);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar117,auVar93);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar103,auVar103);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,auVar94);
    auVar94 = vmulps_avx512vl(local_640,local_640);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar93);
    auVar104 = vfmadd231ps_avx512vl(auVar94,auVar92,auVar92);
    auVar105 = vrcp14ps_avx512vl(auVar104);
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = &DAT_3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar94._16_4_ = 0x3f800000;
    auVar94._20_4_ = 0x3f800000;
    auVar94._24_4_ = 0x3f800000;
    auVar94._28_4_ = 0x3f800000;
    auVar94 = vfnmadd213ps_avx512vl(auVar105,auVar104,auVar94);
    auVar94 = vfmadd132ps_avx512vl(auVar94,auVar105,auVar105);
    auVar103 = vmulps_avx512vl(auVar103,auVar94);
    auVar105 = vmulps_avx512vl(auVar93,auVar101);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar100,local_640);
    auVar106 = vmulps_avx512vl(local_640,auVar99);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar101,auVar92);
    auVar107 = vmulps_avx512vl(auVar92,auVar100);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar99,auVar93);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar94 = vmulps_avx512vl(auVar105,auVar94);
    auVar94 = vmaxps_avx512vl(auVar103,auVar94);
    auVar94 = vsqrtps_avx512vl(auVar94);
    auVar103 = vmaxps_avx512vl(auVar102,auVar95);
    auVar90 = vmaxps_avx512vl(auVar90,auVar103);
    auVar103 = vaddps_avx512vl(auVar94,auVar90);
    auVar90 = vminps_avx512vl(auVar102,auVar95);
    auVar90 = vminps_avx(auVar91,auVar90);
    auVar90 = vsubps_avx512vl(auVar90,auVar94);
    auVar95._8_4_ = 0x3f800002;
    auVar95._0_8_ = 0x3f8000023f800002;
    auVar95._12_4_ = 0x3f800002;
    auVar95._16_4_ = 0x3f800002;
    auVar95._20_4_ = 0x3f800002;
    auVar95._24_4_ = 0x3f800002;
    auVar95._28_4_ = 0x3f800002;
    auVar91 = vmulps_avx512vl(auVar103,auVar95);
    auVar102._8_4_ = 0x3f7ffffc;
    auVar102._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar102._12_4_ = 0x3f7ffffc;
    auVar102._16_4_ = 0x3f7ffffc;
    auVar102._20_4_ = 0x3f7ffffc;
    auVar102._24_4_ = 0x3f7ffffc;
    auVar102._28_4_ = 0x3f7ffffc;
    auVar94 = vmulps_avx512vl(auVar90,auVar102);
    auVar111._4_4_ = auVar91._4_4_ * auVar91._4_4_;
    auVar111._0_4_ = auVar91._0_4_ * auVar91._0_4_;
    auVar111._8_4_ = auVar91._8_4_ * auVar91._8_4_;
    auVar111._12_4_ = auVar91._12_4_ * auVar91._12_4_;
    auVar111._16_4_ = auVar91._16_4_ * auVar91._16_4_;
    auVar111._20_4_ = auVar91._20_4_ * auVar91._20_4_;
    auVar111._24_4_ = auVar91._24_4_ * auVar91._24_4_;
    auVar111._28_4_ = auVar90._28_4_;
    auVar90 = vrsqrt14ps_avx512vl(auVar104);
    auVar103._8_4_ = 0xbf000000;
    auVar103._0_8_ = 0xbf000000bf000000;
    auVar103._12_4_ = 0xbf000000;
    auVar103._16_4_ = 0xbf000000;
    auVar103._20_4_ = 0xbf000000;
    auVar103._24_4_ = 0xbf000000;
    auVar103._28_4_ = 0xbf000000;
    auVar91 = vmulps_avx512vl(auVar104,auVar103);
    auVar112._4_4_ = auVar90._4_4_ * auVar91._4_4_;
    auVar112._0_4_ = auVar90._0_4_ * auVar91._0_4_;
    auVar112._8_4_ = auVar90._8_4_ * auVar91._8_4_;
    auVar112._12_4_ = auVar90._12_4_ * auVar91._12_4_;
    auVar112._16_4_ = auVar90._16_4_ * auVar91._16_4_;
    auVar112._20_4_ = auVar90._20_4_ * auVar91._20_4_;
    auVar112._24_4_ = auVar90._24_4_ * auVar91._24_4_;
    auVar112._28_4_ = auVar91._28_4_;
    auVar91 = vmulps_avx512vl(auVar90,auVar90);
    auVar91 = vmulps_avx512vl(auVar91,auVar112);
    auVar104._8_4_ = 0x3fc00000;
    auVar104._0_8_ = 0x3fc000003fc00000;
    auVar104._12_4_ = 0x3fc00000;
    auVar104._16_4_ = 0x3fc00000;
    auVar104._20_4_ = 0x3fc00000;
    auVar104._24_4_ = 0x3fc00000;
    auVar104._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_avx512vl(auVar91,auVar90,auVar104);
    auVar113._4_4_ = auVar95._4_4_ * auVar92._4_4_;
    auVar113._0_4_ = auVar95._0_4_ * auVar92._0_4_;
    auVar113._8_4_ = auVar95._8_4_ * auVar92._8_4_;
    auVar113._12_4_ = auVar95._12_4_ * auVar92._12_4_;
    auVar113._16_4_ = auVar95._16_4_ * auVar92._16_4_;
    auVar113._20_4_ = auVar95._20_4_ * auVar92._20_4_;
    auVar113._24_4_ = auVar95._24_4_ * auVar92._24_4_;
    auVar113._28_4_ = auVar90._28_4_;
    auVar90 = vmulps_avx512vl(auVar93,auVar95);
    auVar91 = vmulps_avx512vl(local_640,auVar95);
    local_860 = ZEXT1632(auVar82);
    auVar102 = vsubps_avx512vl(auVar108,local_860);
    auVar207 = ZEXT1632(auVar85);
    auVar103 = vsubps_avx512vl(auVar108,auVar207);
    local_7e0 = ZEXT1632(auVar24);
    auVar104 = vsubps_avx512vl(auVar108,local_7e0);
    auVar105 = vmulps_avx512vl(auVar280._0_32_,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar282._0_32_,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar283._0_32_,auVar102);
    auVar106 = vmulps_avx512vl(auVar104,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar103);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar102);
    auVar107 = vmulps_avx512vl(auVar280._0_32_,auVar91);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar90,auVar282._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar113,auVar283._0_32_);
    auVar91 = vmulps_avx512vl(auVar104,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar91,auVar103,auVar90);
    auVar108 = vfmadd231ps_avx512vl(auVar90,auVar102,auVar113);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar90 = vsubps_avx(local_3e0,auVar109);
    auVar91 = vmulps_avx512vl(auVar107,auVar108);
    auVar91 = vsubps_avx512vl(auVar105,auVar91);
    auVar110 = vaddps_avx512vl(auVar91,auVar91);
    auVar91 = vmulps_avx512vl(auVar108,auVar108);
    auVar106 = vsubps_avx512vl(auVar106,auVar91);
    auVar91 = vsubps_avx(auVar106,auVar111);
    auVar111 = vmulps_avx512vl(auVar110,auVar110);
    auVar105._8_4_ = 0x40800000;
    auVar105._0_8_ = 0x4080000040800000;
    auVar105._12_4_ = 0x40800000;
    auVar105._16_4_ = 0x40800000;
    auVar105._20_4_ = 0x40800000;
    auVar105._24_4_ = 0x40800000;
    auVar105._28_4_ = 0x40800000;
    auVar105 = vmulps_avx512vl(auVar90,auVar105);
    auVar112 = vmulps_avx512vl(auVar105,auVar91);
    auVar112 = vsubps_avx512vl(auVar111,auVar112);
    uVar78 = vcmpps_avx512vl(auVar112,ZEXT832(0) << 0x20,5);
    bVar72 = (byte)uVar78;
    if (bVar72 == 0) {
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar112 = vsqrtps_avx512vl(auVar112);
      auVar113 = vaddps_avx512vl(auVar90,auVar90);
      auVar114 = vrcp14ps_avx512vl(auVar113);
      auVar38._8_4_ = 0x3f800000;
      auVar38._0_8_ = &DAT_3f8000003f800000;
      auVar38._12_4_ = 0x3f800000;
      auVar38._16_4_ = 0x3f800000;
      auVar38._20_4_ = 0x3f800000;
      auVar38._24_4_ = 0x3f800000;
      auVar38._28_4_ = 0x3f800000;
      auVar113 = vfnmadd213ps_avx512vl(auVar113,auVar114,auVar38);
      auVar113 = vfmadd132ps_avx512vl(auVar113,auVar114,auVar114);
      auVar39._8_4_ = 0x80000000;
      auVar39._0_8_ = 0x8000000080000000;
      auVar39._12_4_ = 0x80000000;
      auVar39._16_4_ = 0x80000000;
      auVar39._20_4_ = 0x80000000;
      auVar39._24_4_ = 0x80000000;
      auVar39._28_4_ = 0x80000000;
      auVar114 = vxorps_avx512vl(auVar110,auVar39);
      auVar114 = vsubps_avx512vl(auVar114,auVar112);
      auVar114 = vmulps_avx512vl(auVar114,auVar113);
      auVar112 = vsubps_avx512vl(auVar112,auVar110);
      auVar112 = vmulps_avx512vl(auVar112,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar107,auVar114,auVar108);
      local_4e0 = vmulps_avx512vl(auVar95,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar107,auVar112,auVar108);
      local_500 = vmulps_avx512vl(auVar95,auVar113);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar113,auVar114);
      auVar115._0_4_ =
           (uint)(bVar72 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar72 & 1) * local_500._0_4_;
      bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar17 * auVar113._4_4_ | (uint)!bVar17 * local_500._4_4_;
      bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar17 * auVar113._8_4_ | (uint)!bVar17 * local_500._8_4_;
      bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar17 * auVar113._12_4_ | (uint)!bVar17 * local_500._12_4_;
      bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar17 * auVar113._16_4_ | (uint)!bVar17 * local_500._16_4_;
      bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar17 * auVar113._20_4_ | (uint)!bVar17 * local_500._20_4_;
      bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar17 * auVar113._24_4_ | (uint)!bVar17 * local_500._24_4_;
      bVar17 = SUB81(uVar78 >> 7,0);
      auVar115._28_4_ = (uint)bVar17 * auVar113._28_4_ | (uint)!bVar17 * local_500._28_4_;
      auVar220._8_4_ = 0xff800000;
      auVar220._0_8_ = 0xff800000ff800000;
      auVar220._12_4_ = 0xff800000;
      auVar220._16_4_ = 0xff800000;
      auVar220._20_4_ = 0xff800000;
      auVar220._24_4_ = 0xff800000;
      auVar220._28_4_ = 0xff800000;
      auVar113 = vblendmps_avx512vl(auVar220,auVar112);
      auVar116._0_4_ =
           (uint)(bVar72 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar112._0_4_;
      bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar17 * auVar113._4_4_ | (uint)!bVar17 * auVar112._4_4_;
      bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar17 * auVar113._8_4_ | (uint)!bVar17 * auVar112._8_4_;
      bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar17 * auVar113._12_4_ | (uint)!bVar17 * auVar112._12_4_;
      bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar17 * auVar113._16_4_ | (uint)!bVar17 * auVar112._16_4_;
      bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar17 * auVar113._20_4_ | (uint)!bVar17 * auVar112._20_4_;
      bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar17 * auVar113._24_4_ | (uint)!bVar17 * auVar112._24_4_;
      bVar17 = SUB81(uVar78 >> 7,0);
      auVar116._28_4_ = (uint)bVar17 * auVar113._28_4_ | (uint)!bVar17 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar112);
      auVar113 = vmaxps_avx512vl(local_480,auVar112);
      auVar40._8_4_ = 0x36000000;
      auVar40._0_8_ = 0x3600000036000000;
      auVar40._12_4_ = 0x36000000;
      auVar40._16_4_ = 0x36000000;
      auVar40._20_4_ = 0x36000000;
      auVar40._24_4_ = 0x36000000;
      auVar40._28_4_ = 0x36000000;
      auVar113 = vmulps_avx512vl(auVar113,auVar40);
      vandps_avx512vl(auVar90,auVar112);
      uVar69 = vcmpps_avx512vl(auVar113,auVar113,1);
      uVar78 = uVar78 & uVar69;
      bVar74 = (byte)uVar78;
      if (bVar74 != 0) {
        uVar69 = vcmpps_avx512vl(auVar91,ZEXT832(0) << 0x20,2);
        auVar233._8_4_ = 0xff800000;
        auVar233._0_8_ = 0xff800000ff800000;
        auVar233._12_4_ = 0xff800000;
        auVar233._16_4_ = 0xff800000;
        auVar233._20_4_ = 0xff800000;
        auVar233._24_4_ = 0xff800000;
        auVar233._28_4_ = 0xff800000;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vblendmps_avx512vl(auVar91,auVar233);
        bVar70 = (byte)uVar69;
        iVar1 = (uint)(bVar70 & 1) * auVar112._0_4_;
        iVar2 = (uint)((byte)(uVar69 >> 1) & 1) * auVar112._4_4_;
        iVar3 = (uint)((byte)(uVar69 >> 2) & 1) * auVar112._8_4_;
        iVar4 = (uint)((byte)(uVar69 >> 3) & 1) * auVar112._12_4_;
        iVar5 = (uint)((byte)(uVar69 >> 4) & 1) * auVar112._16_4_;
        iVar6 = (uint)((byte)(uVar69 >> 5) & 1) * auVar112._20_4_;
        iVar7 = (uint)((byte)(uVar69 >> 6) & 1) * auVar112._24_4_;
        iVar8 = (uint)(byte)(uVar69 >> 7) * auVar112._28_4_;
        auVar115._0_4_ = (uint)(bVar74 & 1) * iVar1 | !(bool)(bVar74 & 1) * auVar115._0_4_;
        bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar17 * iVar2 | !bVar17 * auVar115._4_4_;
        bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar17 * iVar3 | !bVar17 * auVar115._8_4_;
        bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar17 * iVar4 | !bVar17 * auVar115._12_4_;
        bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar115._16_4_ = (uint)bVar17 * iVar5 | !bVar17 * auVar115._16_4_;
        bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar115._20_4_ = (uint)bVar17 * iVar6 | !bVar17 * auVar115._20_4_;
        bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar115._24_4_ = (uint)bVar17 * iVar7 | !bVar17 * auVar115._24_4_;
        bVar17 = SUB81(uVar78 >> 7,0);
        auVar115._28_4_ = (uint)bVar17 * iVar8 | !bVar17 * auVar115._28_4_;
        auVar91 = vblendmps_avx512vl(auVar233,auVar91);
        bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar20 = (bool)((byte)(uVar69 >> 4) & 1);
        bVar21 = (bool)((byte)(uVar69 >> 5) & 1);
        bVar22 = (bool)((byte)(uVar69 >> 6) & 1);
        bVar23 = SUB81(uVar69 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar74 & 1) *
             ((uint)(bVar70 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar70 & 1) * iVar1) |
             !(bool)(bVar74 & 1) * auVar116._0_4_;
        bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar77 * ((uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * iVar2) |
             !bVar77 * auVar116._4_4_;
        bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar17 * ((uint)bVar18 * auVar91._8_4_ | (uint)!bVar18 * iVar3) |
             !bVar17 * auVar116._8_4_;
        bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar17 * ((uint)bVar19 * auVar91._12_4_ | (uint)!bVar19 * iVar4) |
             !bVar17 * auVar116._12_4_;
        bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar17 * ((uint)bVar20 * auVar91._16_4_ | (uint)!bVar20 * iVar5) |
             !bVar17 * auVar116._16_4_;
        bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar17 * ((uint)bVar21 * auVar91._20_4_ | (uint)!bVar21 * iVar6) |
             !bVar17 * auVar116._20_4_;
        bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar17 * ((uint)bVar22 * auVar91._24_4_ | (uint)!bVar22 * iVar7) |
             !bVar17 * auVar116._24_4_;
        bVar17 = SUB81(uVar78 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar17 * ((uint)bVar23 * auVar91._28_4_ | (uint)!bVar23 * iVar8) |
             !bVar17 * auVar116._28_4_;
        bVar72 = (~bVar74 | bVar70) & bVar72;
      }
    }
    if ((bVar72 & 0x7f) == 0) {
      auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar260 = ZEXT3264(_DAT_02020f20);
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar281 = ZEXT3264(auVar90);
      auVar283 = ZEXT3264(local_800);
      auVar282 = ZEXT3264(local_8c0);
      auVar280 = ZEXT3264(local_820);
    }
    else {
      fVar259 = *(float *)(ray + k * 4 + 0x80) - (float)local_6f0._0_4_;
      auVar221._4_4_ = fVar259;
      auVar221._0_4_ = fVar259;
      auVar221._8_4_ = fVar259;
      auVar221._12_4_ = fVar259;
      auVar221._16_4_ = fVar259;
      auVar221._20_4_ = fVar259;
      auVar221._24_4_ = fVar259;
      auVar221._28_4_ = fVar259;
      auVar112 = vminps_avx512vl(auVar221,auVar116);
      auVar67._4_4_ = fStack_3fc;
      auVar67._0_4_ = local_400;
      auVar67._8_4_ = fStack_3f8;
      auVar67._12_4_ = fStack_3f4;
      auVar67._16_4_ = fStack_3f0;
      auVar67._20_4_ = fStack_3ec;
      auVar67._24_4_ = fStack_3e8;
      auVar67._28_4_ = fStack_3e4;
      auVar91 = vmaxps_avx512vl(auVar67,auVar115);
      auVar104 = vmulps_avx512vl(auVar277,auVar104);
      auVar103 = vfmadd213ps_avx512vl(auVar103,auVar272,auVar104);
      auVar102 = vfmadd213ps_avx512vl(auVar102,auVar117,auVar103);
      auVar280 = ZEXT3264(local_820);
      auVar103 = vmulps_avx512vl(local_820,auVar277);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_8c0,auVar272);
      auVar283 = ZEXT3264(local_800);
      auVar103 = vfmadd231ps_avx512vl(auVar103,local_800,auVar117);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar103,auVar104);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar26 = vcmpps_avx512vl(auVar104,auVar117,1);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar102 = vxorps_avx512vl(auVar102,auVar113);
      auVar114 = vrcp14ps_avx512vl(auVar103);
      auVar118 = vxorps_avx512vl(auVar103,auVar113);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar281 = ZEXT3264(auVar119);
      auVar120 = vfnmadd213ps_avx512vl(auVar114,auVar103,auVar119);
      auVar120 = vfmadd132ps_avx512vl(auVar120,auVar114,auVar114);
      auVar102 = vmulps_avx512vl(auVar120,auVar102);
      uVar27 = vcmpps_avx512vl(auVar103,auVar118,1);
      bVar74 = (byte)uVar26 | (byte)uVar27;
      auVar120 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar121 = vblendmps_avx512vl(auVar102,auVar120);
      auVar122._0_4_ =
           (uint)(bVar74 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar114._0_4_;
      bVar17 = (bool)(bVar74 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar17 * auVar121._4_4_ | (uint)!bVar17 * auVar114._4_4_;
      bVar17 = (bool)(bVar74 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar17 * auVar121._8_4_ | (uint)!bVar17 * auVar114._8_4_;
      bVar17 = (bool)(bVar74 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar17 * auVar121._12_4_ | (uint)!bVar17 * auVar114._12_4_;
      bVar17 = (bool)(bVar74 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar17 * auVar121._16_4_ | (uint)!bVar17 * auVar114._16_4_;
      bVar17 = (bool)(bVar74 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar17 * auVar121._20_4_ | (uint)!bVar17 * auVar114._20_4_;
      bVar17 = (bool)(bVar74 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar17 * auVar121._24_4_ | (uint)!bVar17 * auVar114._24_4_;
      auVar122._28_4_ =
           (uint)(bVar74 >> 7) * auVar121._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar114._28_4_;
      auVar91 = vmaxps_avx(auVar91,auVar122);
      uVar27 = vcmpps_avx512vl(auVar103,auVar118,6);
      bVar74 = (byte)uVar26 | (byte)uVar27;
      auVar278 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar123._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * auVar102._0_4_;
      bVar17 = (bool)(bVar74 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * auVar102._4_4_;
      bVar17 = (bool)(bVar74 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * auVar102._8_4_;
      bVar17 = (bool)(bVar74 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * auVar102._12_4_;
      bVar17 = (bool)(bVar74 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * auVar102._16_4_;
      bVar17 = (bool)(bVar74 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * auVar102._20_4_;
      bVar17 = (bool)(bVar74 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * auVar102._24_4_;
      auVar123._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar102._28_4_;
      auVar102 = vminps_avx(auVar112,auVar123);
      auVar83 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar83),auVar96);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar83),auVar97);
      auVar112 = ZEXT1632(auVar83);
      auVar97 = vsubps_avx512vl(auVar112,auVar98);
      auVar49._4_4_ = auVar97._4_4_ * auVar101._4_4_;
      auVar49._0_4_ = auVar97._0_4_ * auVar101._0_4_;
      auVar49._8_4_ = auVar97._8_4_ * auVar101._8_4_;
      auVar49._12_4_ = auVar97._12_4_ * auVar101._12_4_;
      auVar49._16_4_ = auVar97._16_4_ * auVar101._16_4_;
      auVar49._20_4_ = auVar97._20_4_ * auVar101._20_4_;
      auVar49._24_4_ = auVar97._24_4_ * auVar101._24_4_;
      auVar49._28_4_ = auVar97._28_4_;
      auVar96 = vfnmsub231ps_avx512vl(auVar49,auVar100,auVar96);
      auVar103 = vfnmadd231ps_avx512vl(auVar96,auVar99,auVar103);
      auVar96 = vmulps_avx512vl(local_820,auVar101);
      auVar96 = vfnmsub231ps_avx512vl(auVar96,local_8c0,auVar100);
      auVar96 = vfnmadd231ps_avx512vl(auVar96,local_800,auVar99);
      vandps_avx512vl(auVar96,auVar104);
      uVar26 = vcmpps_avx512vl(auVar96,auVar117,1);
      auVar103 = vxorps_avx512vl(auVar103,auVar113);
      auVar104 = vrcp14ps_avx512vl(auVar96);
      auVar97 = vxorps_avx512vl(auVar96,auVar113);
      auVar270 = ZEXT3264(auVar97);
      auVar98 = vfnmadd213ps_avx512vl(auVar104,auVar96,auVar119);
      auVar83 = vfmadd132ps_fma(auVar98,auVar104,auVar104);
      auVar274 = ZEXT1664(auVar83);
      fVar259 = auVar83._0_4_ * auVar103._0_4_;
      fVar261 = auVar83._4_4_ * auVar103._4_4_;
      auVar50._4_4_ = fVar261;
      auVar50._0_4_ = fVar259;
      fVar262 = auVar83._8_4_ * auVar103._8_4_;
      auVar50._8_4_ = fVar262;
      fVar263 = auVar83._12_4_ * auVar103._12_4_;
      auVar50._12_4_ = fVar263;
      fVar248 = auVar103._16_4_ * 0.0;
      auVar50._16_4_ = fVar248;
      fVar249 = auVar103._20_4_ * 0.0;
      auVar50._20_4_ = fVar249;
      fVar264 = auVar103._24_4_ * 0.0;
      auVar50._24_4_ = fVar264;
      auVar50._28_4_ = auVar103._28_4_;
      uVar27 = vcmpps_avx512vl(auVar96,auVar97,1);
      bVar74 = (byte)uVar26 | (byte)uVar27;
      auVar98 = vblendmps_avx512vl(auVar50,auVar120);
      auVar124._0_4_ =
           (uint)(bVar74 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar74 & 1) * auVar104._0_4_;
      bVar17 = (bool)(bVar74 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar17 * auVar98._4_4_ | (uint)!bVar17 * auVar104._4_4_;
      bVar17 = (bool)(bVar74 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar17 * auVar98._8_4_ | (uint)!bVar17 * auVar104._8_4_;
      bVar17 = (bool)(bVar74 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar17 * auVar98._12_4_ | (uint)!bVar17 * auVar104._12_4_;
      bVar17 = (bool)(bVar74 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar17 * auVar98._16_4_ | (uint)!bVar17 * auVar104._16_4_;
      bVar17 = (bool)(bVar74 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar17 * auVar98._20_4_ | (uint)!bVar17 * auVar104._20_4_;
      bVar17 = (bool)(bVar74 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar17 * auVar98._24_4_ | (uint)!bVar17 * auVar104._24_4_;
      auVar124._28_4_ =
           (uint)(bVar74 >> 7) * auVar98._28_4_ | (uint)!(bool)(bVar74 >> 7) * auVar104._28_4_;
      auVar266 = ZEXT3264(auVar124);
      _local_680 = vmaxps_avx(auVar91,auVar124);
      uVar27 = vcmpps_avx512vl(auVar96,auVar97,6);
      bVar74 = (byte)uVar26 | (byte)uVar27;
      auVar125._0_4_ = (uint)(bVar74 & 1) * 0x7f800000 | (uint)!(bool)(bVar74 & 1) * (int)fVar259;
      bVar17 = (bool)(bVar74 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * (int)fVar261;
      bVar17 = (bool)(bVar74 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * (int)fVar262;
      bVar17 = (bool)(bVar74 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * (int)fVar263;
      bVar17 = (bool)(bVar74 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * (int)fVar248;
      bVar17 = (bool)(bVar74 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * (int)fVar249;
      bVar17 = (bool)(bVar74 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar17 * 0x7f800000 | (uint)!bVar17 * (int)fVar264;
      auVar125._28_4_ =
           (uint)(bVar74 >> 7) * 0x7f800000 | (uint)!(bool)(bVar74 >> 7) * auVar103._28_4_;
      local_440 = vminps_avx(auVar102,auVar125);
      uVar26 = vcmpps_avx512vl(_local_680,local_440,2);
      bVar72 = bVar72 & 0x7f & (byte)uVar26;
      if (bVar72 == 0) {
        auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar260 = ZEXT3264(_DAT_02020f20);
        auVar282 = ZEXT3264(local_8c0);
      }
      else {
        auVar94 = vmaxps_avx512vl(auVar112,auVar94);
        auVar91 = vminps_avx512vl(local_4e0,auVar119);
        auVar56 = ZEXT412(0);
        auVar266 = ZEXT1264(auVar56) << 0x20;
        auVar91 = vmaxps_avx(auVar91,ZEXT1232(auVar56) << 0x20);
        auVar102 = vminps_avx512vl(local_500,auVar119);
        auVar273._8_4_ = 0x3e000000;
        auVar273._0_8_ = 0x3e0000003e000000;
        auVar273._12_4_ = 0x3e000000;
        auVar273._16_4_ = 0x3e000000;
        auVar273._20_4_ = 0x3e000000;
        auVar273._24_4_ = 0x3e000000;
        auVar273._28_4_ = 0x3e000000;
        auVar51._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar91._28_4_ + 7.0;
        auVar83 = vfmadd213ps_fma(auVar51,local_7c0,auVar232);
        local_4e0 = ZEXT1632(auVar83);
        auVar91 = vmaxps_avx(auVar102,ZEXT1232(auVar56) << 0x20);
        auVar52._4_4_ = (auVar91._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar91._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar91._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar91._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar91._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar91._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar91._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar91._28_4_ + 7.0;
        auVar83 = vfmadd213ps_fma(auVar52,local_7c0,auVar232);
        local_500 = ZEXT1632(auVar83);
        auVar222._0_4_ = auVar94._0_4_ * auVar94._0_4_;
        auVar222._4_4_ = auVar94._4_4_ * auVar94._4_4_;
        auVar222._8_4_ = auVar94._8_4_ * auVar94._8_4_;
        auVar222._12_4_ = auVar94._12_4_ * auVar94._12_4_;
        auVar222._16_4_ = auVar94._16_4_ * auVar94._16_4_;
        auVar222._20_4_ = auVar94._20_4_ * auVar94._20_4_;
        auVar222._24_4_ = auVar94._24_4_ * auVar94._24_4_;
        auVar222._28_4_ = 0;
        auVar91 = vsubps_avx(auVar106,auVar222);
        auVar94 = vmulps_avx512vl(auVar105,auVar91);
        auVar94 = vsubps_avx512vl(auVar111,auVar94);
        uVar26 = vcmpps_avx512vl(auVar94,ZEXT1232(auVar56) << 0x20,5);
        bVar74 = (byte)uVar26;
        if (bVar74 == 0) {
          auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar126._8_4_ = 0x7f800000;
          auVar126._0_8_ = 0x7f8000007f800000;
          auVar126._12_4_ = 0x7f800000;
          auVar126._16_4_ = 0x7f800000;
          auVar126._20_4_ = 0x7f800000;
          auVar126._24_4_ = 0x7f800000;
          auVar126._28_4_ = 0x7f800000;
          auVar127._8_4_ = 0xff800000;
          auVar127._0_8_ = 0xff800000ff800000;
          auVar127._12_4_ = 0xff800000;
          auVar127._16_4_ = 0xff800000;
          auVar127._20_4_ = 0xff800000;
          auVar127._24_4_ = 0xff800000;
          auVar127._28_4_ = 0xff800000;
        }
        else {
          auVar85 = vxorps_avx512vl(auVar105._0_16_,auVar105._0_16_);
          uVar78 = vcmpps_avx512vl(auVar94,auVar112,5);
          auVar94 = vsqrtps_avx(auVar94);
          auVar234._0_4_ = auVar90._0_4_ + auVar90._0_4_;
          auVar234._4_4_ = auVar90._4_4_ + auVar90._4_4_;
          auVar234._8_4_ = auVar90._8_4_ + auVar90._8_4_;
          auVar234._12_4_ = auVar90._12_4_ + auVar90._12_4_;
          auVar234._16_4_ = auVar90._16_4_ + auVar90._16_4_;
          auVar234._20_4_ = auVar90._20_4_ + auVar90._20_4_;
          auVar234._24_4_ = auVar90._24_4_ + auVar90._24_4_;
          auVar234._28_4_ = auVar90._28_4_ + auVar90._28_4_;
          auVar102 = vrcp14ps_avx512vl(auVar234);
          auVar103 = vfnmadd213ps_avx512vl(auVar234,auVar102,auVar119);
          auVar83 = vfmadd132ps_fma(auVar103,auVar102,auVar102);
          auVar41._8_4_ = 0x80000000;
          auVar41._0_8_ = 0x8000000080000000;
          auVar41._12_4_ = 0x80000000;
          auVar41._16_4_ = 0x80000000;
          auVar41._20_4_ = 0x80000000;
          auVar41._24_4_ = 0x80000000;
          auVar41._28_4_ = 0x80000000;
          auVar102 = vxorps_avx512vl(auVar110,auVar41);
          auVar102 = vsubps_avx(auVar102,auVar94);
          auVar53._4_4_ = auVar102._4_4_ * auVar83._4_4_;
          auVar53._0_4_ = auVar102._0_4_ * auVar83._0_4_;
          auVar53._8_4_ = auVar102._8_4_ * auVar83._8_4_;
          auVar53._12_4_ = auVar102._12_4_ * auVar83._12_4_;
          auVar53._16_4_ = auVar102._16_4_ * 0.0;
          auVar53._20_4_ = auVar102._20_4_ * 0.0;
          auVar53._24_4_ = auVar102._24_4_ * 0.0;
          auVar53._28_4_ = 0x3e000000;
          auVar94 = vsubps_avx512vl(auVar94,auVar110);
          auVar54._4_4_ = auVar94._4_4_ * auVar83._4_4_;
          auVar54._0_4_ = auVar94._0_4_ * auVar83._0_4_;
          auVar54._8_4_ = auVar94._8_4_ * auVar83._8_4_;
          auVar54._12_4_ = auVar94._12_4_ * auVar83._12_4_;
          auVar54._16_4_ = auVar94._16_4_ * 0.0;
          auVar54._20_4_ = auVar94._20_4_ * 0.0;
          auVar54._24_4_ = auVar94._24_4_ * 0.0;
          auVar54._28_4_ = 0x7f800000;
          auVar278 = ZEXT3264(auVar54);
          auVar94 = vfmadd213ps_avx512vl(auVar107,auVar53,auVar108);
          auVar55._4_4_ = auVar95._4_4_ * auVar94._4_4_;
          auVar55._0_4_ = auVar95._0_4_ * auVar94._0_4_;
          auVar55._8_4_ = auVar95._8_4_ * auVar94._8_4_;
          auVar55._12_4_ = auVar95._12_4_ * auVar94._12_4_;
          auVar55._16_4_ = auVar95._16_4_ * auVar94._16_4_;
          auVar55._20_4_ = auVar95._20_4_ * auVar94._20_4_;
          auVar55._24_4_ = auVar95._24_4_ * auVar94._24_4_;
          auVar55._28_4_ = auVar102._28_4_;
          auVar94 = vmulps_avx512vl(local_800,auVar53);
          auVar103 = vmulps_avx512vl(local_8c0,auVar53);
          auVar104 = vmulps_avx512vl(local_820,auVar53);
          auVar102 = vfmadd213ps_avx512vl(auVar92,auVar55,local_860);
          auVar102 = vsubps_avx512vl(auVar94,auVar102);
          auVar94 = vfmadd213ps_avx512vl(auVar93,auVar55,auVar207);
          auVar103 = vsubps_avx512vl(auVar103,auVar94);
          auVar83 = vfmadd213ps_fma(auVar55,local_640,local_7e0);
          auVar94 = vsubps_avx(auVar104,ZEXT1632(auVar83));
          auVar104 = vfmadd213ps_avx512vl(auVar107,auVar54,auVar108);
          auVar95 = vmulps_avx512vl(auVar95,auVar104);
          auVar104 = vmulps_avx512vl(local_800,auVar54);
          auVar105 = vmulps_avx512vl(local_8c0,auVar54);
          auVar96 = vmulps_avx512vl(local_820,auVar54);
          auVar83 = vfmadd213ps_fma(auVar92,auVar95,local_860);
          auVar92 = vsubps_avx(auVar104,ZEXT1632(auVar83));
          auVar266 = ZEXT3264(auVar92);
          auVar83 = vfmadd213ps_fma(auVar93,auVar95,auVar207);
          auVar92 = vsubps_avx512vl(auVar105,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(local_640,auVar95,local_7e0);
          auVar93 = vsubps_avx512vl(auVar96,ZEXT1632(auVar83));
          auVar157._8_4_ = 0x7f800000;
          auVar157._0_8_ = 0x7f8000007f800000;
          auVar157._12_4_ = 0x7f800000;
          auVar157._16_4_ = 0x7f800000;
          auVar157._20_4_ = 0x7f800000;
          auVar157._24_4_ = 0x7f800000;
          auVar157._28_4_ = 0x7f800000;
          auVar95 = vblendmps_avx512vl(auVar157,auVar53);
          bVar17 = (bool)((byte)uVar78 & 1);
          auVar126._0_4_ = (uint)bVar17 * auVar95._0_4_ | (uint)!bVar17 * auVar82._0_4_;
          bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * auVar82._4_4_;
          bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * auVar82._8_4_;
          bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * auVar82._12_4_;
          iVar5 = (uint)((byte)(uVar78 >> 4) & 1) * auVar95._16_4_;
          auVar126._16_4_ = iVar5;
          iVar4 = (uint)((byte)(uVar78 >> 5) & 1) * auVar95._20_4_;
          auVar126._20_4_ = iVar4;
          iVar3 = (uint)((byte)(uVar78 >> 6) & 1) * auVar95._24_4_;
          auVar126._24_4_ = iVar3;
          iVar2 = (uint)(byte)(uVar78 >> 7) * auVar95._28_4_;
          auVar126._28_4_ = iVar2;
          auVar158._8_4_ = 0xff800000;
          auVar158._0_8_ = 0xff800000ff800000;
          auVar158._12_4_ = 0xff800000;
          auVar158._16_4_ = 0xff800000;
          auVar158._20_4_ = 0xff800000;
          auVar158._24_4_ = 0xff800000;
          auVar158._28_4_ = 0xff800000;
          auVar95 = vblendmps_avx512vl(auVar158,auVar54);
          bVar17 = (bool)((byte)uVar78 & 1);
          auVar127._0_4_ = (uint)bVar17 * auVar95._0_4_ | (uint)!bVar17 * -0x800000;
          bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar17 * auVar95._4_4_ | (uint)!bVar17 * -0x800000;
          bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar17 * auVar95._8_4_ | (uint)!bVar17 * -0x800000;
          bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar17 * auVar95._12_4_ | (uint)!bVar17 * -0x800000;
          bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar127._16_4_ = (uint)bVar17 * auVar95._16_4_ | (uint)!bVar17 * -0x800000;
          bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar127._20_4_ = (uint)bVar17 * auVar95._20_4_ | (uint)!bVar17 * -0x800000;
          bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar127._24_4_ = (uint)bVar17 * auVar95._24_4_ | (uint)!bVar17 * -0x800000;
          bVar17 = SUB81(uVar78 >> 7,0);
          auVar127._28_4_ = (uint)bVar17 * auVar95._28_4_ | (uint)!bVar17 * -0x800000;
          auVar254._8_4_ = 0x7fffffff;
          auVar254._0_8_ = 0x7fffffff7fffffff;
          auVar254._12_4_ = 0x7fffffff;
          auVar254._16_4_ = 0x7fffffff;
          auVar254._20_4_ = 0x7fffffff;
          auVar254._24_4_ = 0x7fffffff;
          auVar254._28_4_ = 0x7fffffff;
          vandps_avx512vl(auVar109,auVar254);
          auVar95 = vmaxps_avx(local_480,auVar127);
          auVar42._8_4_ = 0x36000000;
          auVar42._0_8_ = 0x3600000036000000;
          auVar42._12_4_ = 0x36000000;
          auVar42._16_4_ = 0x36000000;
          auVar42._20_4_ = 0x36000000;
          auVar42._24_4_ = 0x36000000;
          auVar42._28_4_ = 0x36000000;
          auVar95 = vmulps_avx512vl(auVar95,auVar42);
          auVar90 = vandps_avx(auVar90,auVar254);
          uVar69 = vcmpps_avx512vl(auVar90,auVar95,1);
          uVar78 = uVar78 & uVar69;
          bVar70 = (byte)uVar78;
          auVar273 = local_480;
          if (bVar70 != 0) {
            uVar69 = vcmpps_avx512vl(auVar91,ZEXT1632(auVar85),2);
            auVar255._8_4_ = 0xff800000;
            auVar255._0_8_ = 0xff800000ff800000;
            auVar255._12_4_ = 0xff800000;
            auVar255._16_4_ = 0xff800000;
            auVar255._20_4_ = 0xff800000;
            auVar255._24_4_ = 0xff800000;
            auVar255._28_4_ = 0xff800000;
            auVar269._8_4_ = 0x7f800000;
            auVar269._0_8_ = 0x7f8000007f800000;
            auVar269._12_4_ = 0x7f800000;
            auVar269._16_4_ = 0x7f800000;
            auVar269._20_4_ = 0x7f800000;
            auVar269._24_4_ = 0x7f800000;
            auVar269._28_4_ = 0x7f800000;
            auVar90 = vblendmps_avx512vl(auVar269,auVar255);
            bVar68 = (byte)uVar69;
            uVar73 = (uint)(bVar68 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar95._0_4_;
            bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
            uVar135 = (uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * auVar95._4_4_;
            bVar17 = (bool)((byte)(uVar69 >> 2) & 1);
            uVar136 = (uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * auVar95._8_4_;
            bVar17 = (bool)((byte)(uVar69 >> 3) & 1);
            uVar137 = (uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * auVar95._12_4_;
            bVar17 = (bool)((byte)(uVar69 >> 4) & 1);
            uVar138 = (uint)bVar17 * auVar90._16_4_ | (uint)!bVar17 * auVar95._16_4_;
            bVar17 = (bool)((byte)(uVar69 >> 5) & 1);
            uVar139 = (uint)bVar17 * auVar90._20_4_ | (uint)!bVar17 * auVar95._20_4_;
            bVar17 = (bool)((byte)(uVar69 >> 6) & 1);
            uVar140 = (uint)bVar17 * auVar90._24_4_ | (uint)!bVar17 * auVar95._24_4_;
            bVar17 = SUB81(uVar69 >> 7,0);
            uVar141 = (uint)bVar17 * auVar90._28_4_ | (uint)!bVar17 * auVar95._28_4_;
            auVar126._0_4_ = (bVar70 & 1) * uVar73 | !(bool)(bVar70 & 1) * auVar126._0_4_;
            bVar17 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar126._4_4_ = bVar17 * uVar135 | !bVar17 * auVar126._4_4_;
            bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar126._8_4_ = bVar17 * uVar136 | !bVar17 * auVar126._8_4_;
            bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar126._12_4_ = bVar17 * uVar137 | !bVar17 * auVar126._12_4_;
            bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar126._16_4_ = bVar17 * uVar138 | (uint)!bVar17 * iVar5;
            bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar126._20_4_ = bVar17 * uVar139 | (uint)!bVar17 * iVar4;
            bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar126._24_4_ = bVar17 * uVar140 | (uint)!bVar17 * iVar3;
            bVar17 = SUB81(uVar78 >> 7,0);
            auVar126._28_4_ = bVar17 * uVar141 | (uint)!bVar17 * iVar2;
            auVar90 = vblendmps_avx512vl(auVar255,auVar269);
            bVar17 = (bool)((byte)(uVar69 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar69 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar69 >> 3) & 1);
            bVar20 = (bool)((byte)(uVar69 >> 4) & 1);
            bVar21 = (bool)((byte)(uVar69 >> 5) & 1);
            bVar22 = (bool)((byte)(uVar69 >> 6) & 1);
            bVar23 = SUB81(uVar69 >> 7,0);
            auVar127._0_4_ =
                 (uint)(bVar70 & 1) *
                 ((uint)(bVar68 & 1) * auVar90._0_4_ | !(bool)(bVar68 & 1) * uVar73) |
                 !(bool)(bVar70 & 1) * auVar127._0_4_;
            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar127._4_4_ =
                 (uint)bVar77 * ((uint)bVar17 * auVar90._4_4_ | !bVar17 * uVar135) |
                 !bVar77 * auVar127._4_4_;
            bVar17 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar127._8_4_ =
                 (uint)bVar17 * ((uint)bVar18 * auVar90._8_4_ | !bVar18 * uVar136) |
                 !bVar17 * auVar127._8_4_;
            bVar17 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar127._12_4_ =
                 (uint)bVar17 * ((uint)bVar19 * auVar90._12_4_ | !bVar19 * uVar137) |
                 !bVar17 * auVar127._12_4_;
            bVar17 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar127._16_4_ =
                 (uint)bVar17 * ((uint)bVar20 * auVar90._16_4_ | !bVar20 * uVar138) |
                 !bVar17 * auVar127._16_4_;
            bVar17 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar127._20_4_ =
                 (uint)bVar17 * ((uint)bVar21 * auVar90._20_4_ | !bVar21 * uVar139) |
                 !bVar17 * auVar127._20_4_;
            bVar17 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar127._24_4_ =
                 (uint)bVar17 * ((uint)bVar22 * auVar90._24_4_ | !bVar22 * uVar140) |
                 !bVar17 * auVar127._24_4_;
            bVar17 = SUB81(uVar78 >> 7,0);
            auVar127._28_4_ =
                 (uint)bVar17 * ((uint)bVar23 * auVar90._28_4_ | !bVar23 * uVar141) |
                 !bVar17 * auVar127._28_4_;
            bVar74 = (~bVar70 | bVar68) & bVar74;
          }
        }
        auVar267._8_4_ = 0x7fffffff;
        auVar267._0_8_ = 0x7fffffff7fffffff;
        auVar267._12_4_ = 0x7fffffff;
        auVar282 = ZEXT3264(local_8c0);
        auVar274 = ZEXT3264(auVar273);
        auVar270 = ZEXT1664(auVar267);
        auVar90 = vmulps_avx512vl(local_820,auVar93);
        auVar90 = vfmadd231ps_avx512vl(auVar90,local_8c0,auVar92);
        auVar90 = vfmadd231ps_avx512vl(auVar90,local_800,auVar266._0_32_);
        _local_1c0 = _local_680;
        local_1a0 = vminps_avx(local_440,auVar126);
        auVar247._8_4_ = 0x7fffffff;
        auVar247._0_8_ = 0x7fffffff7fffffff;
        auVar247._12_4_ = 0x7fffffff;
        auVar247._16_4_ = 0x7fffffff;
        auVar247._20_4_ = 0x7fffffff;
        auVar247._24_4_ = 0x7fffffff;
        auVar247._28_4_ = 0x7fffffff;
        auVar90 = vandps_avx(auVar90,auVar247);
        _local_460 = vmaxps_avx(_local_680,auVar127);
        auVar241 = ZEXT3264(_local_460);
        auVar159._8_4_ = 0x3e99999a;
        auVar159._0_8_ = 0x3e99999a3e99999a;
        auVar159._12_4_ = 0x3e99999a;
        auVar159._16_4_ = 0x3e99999a;
        auVar159._20_4_ = 0x3e99999a;
        auVar159._24_4_ = 0x3e99999a;
        auVar159._28_4_ = 0x3e99999a;
        uVar26 = vcmpps_avx512vl(auVar90,auVar159,1);
        local_8cc = (undefined4)uVar26;
        uVar26 = vcmpps_avx512vl(_local_680,local_1a0,2);
        bVar70 = (byte)uVar26 & bVar72;
        _local_540 = _local_460;
        uVar27 = vcmpps_avx512vl(_local_460,local_440,2);
        if ((bVar72 & ((byte)uVar27 | (byte)uVar26)) == 0) {
          auVar258 = ZEXT3264(auVar247);
          auVar260 = ZEXT3264(_DAT_02020f20);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar281 = ZEXT3264(auVar90);
        }
        else {
          auVar90 = vmulps_avx512vl(local_820,auVar94);
          auVar90 = vfmadd213ps_avx512vl(auVar103,local_8c0,auVar90);
          auVar90 = vfmadd213ps_avx512vl(auVar102,local_800,auVar90);
          auVar90 = vandps_avx(auVar90,auVar247);
          uVar26 = vcmpps_avx512vl(auVar90,auVar159,1);
          local_8d4 = (uint)(byte)~bVar74;
          bVar74 = (byte)uVar26 | ~bVar74;
          auVar160._8_4_ = 2;
          auVar160._0_8_ = 0x200000002;
          auVar160._12_4_ = 2;
          auVar160._16_4_ = 2;
          auVar160._20_4_ = 2;
          auVar160._24_4_ = 2;
          auVar160._28_4_ = 2;
          auVar43._8_4_ = 3;
          auVar43._0_8_ = 0x300000003;
          auVar43._12_4_ = 3;
          auVar43._16_4_ = 3;
          auVar43._20_4_ = 3;
          auVar43._24_4_ = 3;
          auVar43._28_4_ = 3;
          auVar90 = vpblendmd_avx512vl(auVar160,auVar43);
          local_420._0_4_ = (uint)(bVar74 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
          bVar17 = (bool)(bVar74 >> 1 & 1);
          local_420._4_4_ = (uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * 2;
          bVar17 = (bool)(bVar74 >> 2 & 1);
          local_420._8_4_ = (uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * 2;
          bVar17 = (bool)(bVar74 >> 3 & 1);
          local_420._12_4_ = (uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * 2;
          bVar17 = (bool)(bVar74 >> 4 & 1);
          local_420._16_4_ = (uint)bVar17 * auVar90._16_4_ | (uint)!bVar17 * 2;
          bVar17 = (bool)(bVar74 >> 5 & 1);
          local_420._20_4_ = (uint)bVar17 * auVar90._20_4_ | (uint)!bVar17 * 2;
          bVar17 = (bool)(bVar74 >> 6 & 1);
          local_420._24_4_ = (uint)bVar17 * auVar90._24_4_ | (uint)!bVar17 * 2;
          local_420._28_4_ = (uint)(bVar74 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2;
          local_4a0 = vpbroadcastd_avx512vl();
          uVar26 = vpcmpd_avx512vl(local_4a0,local_420,5);
          local_8d0 = (uint)bVar70;
          bVar70 = (byte)uVar26 & bVar70;
          if (bVar70 != 0) {
            auVar82 = vminps_avx(local_720._0_16_,local_760._0_16_);
            auVar83 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
            auVar85 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar24 = vminps_avx(auVar82,auVar85);
            auVar82 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar85 = vmaxps_avx(auVar83,auVar82);
            auVar83 = vandps_avx(auVar267,auVar24);
            auVar82 = vandps_avx(auVar267,auVar85);
            auVar83 = vmaxps_avx(auVar83,auVar82);
            auVar82 = vmovshdup_avx(auVar83);
            auVar82 = vmaxss_avx(auVar82,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar82);
            fVar259 = auVar83._0_4_ * 1.9073486e-06;
            local_700 = vshufps_avx(auVar85,auVar85,0xff);
            local_520 = (float)local_680._0_4_ + (float)local_660._0_4_;
            fStack_51c = (float)local_680._4_4_ + (float)local_660._4_4_;
            fStack_518 = fStack_678 + fStack_658;
            fStack_514 = fStack_674 + fStack_654;
            fStack_510 = fStack_670 + fStack_650;
            fStack_50c = fStack_66c + fStack_64c;
            fStack_508 = fStack_668 + fStack_648;
            fStack_504 = fStack_664 + fStack_644;
            do {
              auVar161._8_4_ = 0x7f800000;
              auVar161._0_8_ = 0x7f8000007f800000;
              auVar161._12_4_ = 0x7f800000;
              auVar161._16_4_ = 0x7f800000;
              auVar161._20_4_ = 0x7f800000;
              auVar161._24_4_ = 0x7f800000;
              auVar161._28_4_ = 0x7f800000;
              auVar90 = vblendmps_avx512vl(auVar161,_local_680);
              auVar128._0_4_ =
                   (uint)(bVar70 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
              bVar17 = (bool)(bVar70 >> 1 & 1);
              auVar128._4_4_ = (uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar70 >> 2 & 1);
              auVar128._8_4_ = (uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar70 >> 3 & 1);
              auVar128._12_4_ = (uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar70 >> 4 & 1);
              auVar128._16_4_ = (uint)bVar17 * auVar90._16_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar70 >> 5 & 1);
              auVar128._20_4_ = (uint)bVar17 * auVar90._20_4_ | (uint)!bVar17 * 0x7f800000;
              auVar128._24_4_ =
                   (uint)(bVar70 >> 6) * auVar90._24_4_ | (uint)!(bool)(bVar70 >> 6) * 0x7f800000;
              auVar128._28_4_ = 0x7f800000;
              auVar90 = vshufps_avx(auVar128,auVar128,0xb1);
              auVar90 = vminps_avx(auVar128,auVar90);
              auVar91 = vshufpd_avx(auVar90,auVar90,5);
              auVar90 = vminps_avx(auVar90,auVar91);
              auVar91 = vpermpd_avx2(auVar90,0x4e);
              auVar90 = vminps_avx(auVar90,auVar91);
              uVar26 = vcmpps_avx512vl(auVar128,auVar90,0);
              bVar68 = (byte)uVar26 & bVar70;
              bVar74 = bVar70;
              if (bVar68 != 0) {
                bVar74 = bVar68;
              }
              iVar2 = 0;
              for (uVar73 = (uint)bVar74; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar73 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
              fVar261 = *(float *)(local_1c0 + (uint)(iVar2 << 2));
              fVar262 = local_8c8;
              if ((float)local_7a0._0_4_ < 0.0) {
                fVar262 = sqrtf((float)local_7a0._0_4_);
              }
              auVar266 = ZEXT464(uVar73);
              lVar76 = 4;
              do {
                auVar149._4_4_ = fVar261;
                auVar149._0_4_ = fVar261;
                auVar149._8_4_ = fVar261;
                auVar149._12_4_ = fVar261;
                auVar83 = vfmadd132ps_fma(auVar149,ZEXT816(0) << 0x40,local_790);
                fVar265 = auVar266._0_4_;
                fVar236 = 1.0 - fVar265;
                fVar249 = fVar236 * fVar236 * fVar236;
                fVar263 = fVar265 * fVar265;
                fVar251 = fVar265 * fVar263;
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar249),
                                          ZEXT416((uint)fVar251));
                fVar248 = fVar265 * fVar236;
                auVar227 = ZEXT416((uint)fVar236);
                auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar265 * fVar248 * 6.0)),
                                          ZEXT416((uint)(fVar248 * fVar236)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                          ZEXT416((uint)fVar249));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar236 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar265 * fVar248)));
                fVar249 = fVar249 * 0.16666667;
                fVar264 = (auVar82._0_4_ + auVar24._0_4_) * 0.16666667;
                fVar235 = (auVar85._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar251 = fVar251 * 0.16666667;
                auVar197._0_4_ = fVar251 * (float)local_780._0_4_;
                auVar197._4_4_ = fVar251 * (float)local_780._4_4_;
                auVar197._8_4_ = fVar251 * fStack_778;
                auVar197._12_4_ = fVar251 * fStack_774;
                auVar228._4_4_ = fVar235;
                auVar228._0_4_ = fVar235;
                auVar228._8_4_ = fVar235;
                auVar228._12_4_ = fVar235;
                auVar82 = vfmadd132ps_fma(auVar228,auVar197,local_740._0_16_);
                auVar198._4_4_ = fVar264;
                auVar198._0_4_ = fVar264;
                auVar198._8_4_ = fVar264;
                auVar198._12_4_ = fVar264;
                auVar82 = vfmadd132ps_fma(auVar198,auVar82,local_760._0_16_);
                auVar175._4_4_ = fVar249;
                auVar175._0_4_ = fVar249;
                auVar175._8_4_ = fVar249;
                auVar175._12_4_ = fVar249;
                auVar82 = vfmadd132ps_fma(auVar175,auVar82,local_720._0_16_);
                local_640._0_16_ = auVar82;
                auVar83 = vsubps_avx(auVar83,auVar82);
                local_7c0._0_16_ = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                auVar82 = auVar266._0_16_;
                local_7e0._0_16_ = auVar83;
                if (auVar83._0_4_ < 0.0) {
                  local_860._0_4_ = fVar263;
                  auVar270._0_4_ = sqrtf(auVar83._0_4_);
                  auVar270._4_60_ = extraout_var;
                  auVar83 = auVar270._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  local_860._0_4_ = fVar263;
                }
                auVar24 = vfnmsub213ss_fma(auVar82,auVar82,ZEXT416((uint)(fVar248 * 4.0)));
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * 4.0)),auVar227,auVar227);
                fVar263 = fVar236 * -fVar236 * 0.5;
                fVar248 = auVar24._0_4_ * 0.5;
                fVar249 = auVar85._0_4_ * 0.5;
                local_860._0_4_ = (float)local_860._0_4_ * 0.5;
                auVar216._0_4_ = (float)local_860._0_4_ * (float)local_780._0_4_;
                auVar216._4_4_ = (float)local_860._0_4_ * (float)local_780._4_4_;
                auVar216._8_4_ = (float)local_860._0_4_ * fStack_778;
                auVar216._12_4_ = (float)local_860._0_4_ * fStack_774;
                auVar176._4_4_ = fVar249;
                auVar176._0_4_ = fVar249;
                auVar176._8_4_ = fVar249;
                auVar176._12_4_ = fVar249;
                auVar85 = vfmadd132ps_fma(auVar176,auVar216,local_740._0_16_);
                auVar199._4_4_ = fVar248;
                auVar199._0_4_ = fVar248;
                auVar199._8_4_ = fVar248;
                auVar199._12_4_ = fVar248;
                auVar85 = vfmadd132ps_fma(auVar199,auVar85,local_760._0_16_);
                auVar275._4_4_ = fVar263;
                auVar275._0_4_ = fVar263;
                auVar275._8_4_ = fVar263;
                auVar275._12_4_ = fVar263;
                local_860._0_16_ = vfmadd132ps_fma(auVar275,auVar85,local_720._0_16_);
                local_6b0 = vdpps_avx(local_860._0_16_,local_860._0_16_,0x7f);
                auVar57._12_4_ = 0;
                auVar57._0_12_ = ZEXT812(0);
                fVar263 = local_6b0._0_4_;
                auVar85 = vrsqrt14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar263));
                fVar248 = auVar85._0_4_;
                local_6c0 = vrcp14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar263));
                auVar85 = vfnmadd213ss_fma(local_6c0,local_6b0,ZEXT416(0x40000000));
                uVar73 = auVar83._0_4_;
                local_6a0 = fVar236;
                fStack_69c = fVar236;
                fStack_698 = fVar236;
                fStack_694 = fVar236;
                if (fVar263 < -fVar263) {
                  auVar258._0_4_ = sqrtf(fVar263);
                  auVar258._4_60_ = extraout_var_00;
                  auVar83 = ZEXT416(uVar73);
                  auVar86 = auVar258._0_16_;
                  auVar24 = local_860._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx512f(local_6b0,local_6b0);
                  auVar24 = local_860._0_16_;
                }
                fVar263 = fVar248 * 1.5 + fVar263 * -0.5 * fVar248 * fVar248 * fVar248;
                auVar150._0_4_ = auVar24._0_4_ * fVar263;
                auVar150._4_4_ = auVar24._4_4_ * fVar263;
                auVar150._8_4_ = auVar24._8_4_ * fVar263;
                auVar150._12_4_ = auVar24._12_4_ * fVar263;
                auVar25 = vdpps_avx(local_7c0._0_16_,auVar150,0x7f);
                fVar264 = auVar83._0_4_;
                fVar248 = auVar25._0_4_;
                auVar151._0_4_ = fVar248 * fVar248;
                auVar151._4_4_ = auVar25._4_4_ * auVar25._4_4_;
                auVar151._8_4_ = auVar25._8_4_ * auVar25._8_4_;
                auVar151._12_4_ = auVar25._12_4_ * auVar25._12_4_;
                auVar87 = vsubps_avx512vl(local_7e0._0_16_,auVar151);
                fVar249 = auVar87._0_4_;
                auVar177._4_12_ = ZEXT812(0) << 0x20;
                auVar177._0_4_ = fVar249;
                auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
                auVar88 = vmulss_avx512f(auVar84,ZEXT416(0x3fc00000));
                auVar89 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar249 < 0.0) {
                  local_6e0 = fVar263;
                  fStack_6dc = fVar263;
                  fStack_6d8 = fVar263;
                  fStack_6d4 = fVar263;
                  local_6d0 = auVar84;
                  fVar249 = sqrtf(fVar249);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar83 = ZEXT416(uVar73);
                  auVar24 = local_860._0_16_;
                  auVar84 = local_6d0;
                  fVar263 = local_6e0;
                  fVar235 = fStack_6dc;
                  fVar251 = fStack_6d8;
                  fVar236 = fStack_6d4;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar249 = auVar87._0_4_;
                  fVar235 = fVar263;
                  fVar251 = fVar263;
                  fVar236 = fVar263;
                }
                auVar278 = ZEXT1664(auVar24);
                auVar268._8_4_ = 0x7fffffff;
                auVar268._0_8_ = 0x7fffffff7fffffff;
                auVar268._12_4_ = 0x7fffffff;
                auVar270 = ZEXT1664(auVar268);
                auVar283 = ZEXT3264(local_800);
                auVar282 = ZEXT3264(local_8c0);
                auVar280 = ZEXT3264(local_820);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar227,auVar82);
                auVar82 = vfmadd231ss_fma(auVar227,auVar82,SUB6416(ZEXT464(0xc0000000),0));
                auVar200._0_4_ = fVar265 * (float)local_780._0_4_;
                auVar200._4_4_ = fVar265 * (float)local_780._4_4_;
                auVar200._8_4_ = fVar265 * fStack_778;
                auVar200._12_4_ = fVar265 * fStack_774;
                auVar217._0_4_ = auVar82._0_4_;
                auVar217._4_4_ = auVar217._0_4_;
                auVar217._8_4_ = auVar217._0_4_;
                auVar217._12_4_ = auVar217._0_4_;
                auVar82 = vfmadd132ps_fma(auVar217,auVar200,local_740._0_16_);
                auVar178._0_4_ = auVar87._0_4_;
                auVar178._4_4_ = auVar178._0_4_;
                auVar178._8_4_ = auVar178._0_4_;
                auVar178._12_4_ = auVar178._0_4_;
                auVar82 = vfmadd132ps_fma(auVar178,auVar82,local_760._0_16_);
                auVar63._4_4_ = fStack_69c;
                auVar63._0_4_ = local_6a0;
                auVar63._8_4_ = fStack_698;
                auVar63._12_4_ = fStack_694;
                auVar82 = vfmadd132ps_fma(auVar63,auVar82,local_720._0_16_);
                auVar179._0_4_ = auVar82._0_4_ * (float)local_6b0._0_4_;
                auVar179._4_4_ = auVar82._4_4_ * (float)local_6b0._0_4_;
                auVar179._8_4_ = auVar82._8_4_ * (float)local_6b0._0_4_;
                auVar179._12_4_ = auVar82._12_4_ * (float)local_6b0._0_4_;
                auVar82 = vdpps_avx(auVar24,auVar82,0x7f);
                fVar250 = auVar82._0_4_;
                auVar201._0_4_ = auVar24._0_4_ * fVar250;
                auVar201._4_4_ = auVar24._4_4_ * fVar250;
                auVar201._8_4_ = auVar24._8_4_ * fVar250;
                auVar201._12_4_ = auVar24._12_4_ * fVar250;
                auVar82 = vsubps_avx(auVar179,auVar201);
                fVar250 = auVar85._0_4_ * (float)local_6c0._0_4_;
                auVar35._8_4_ = 0x80000000;
                auVar35._0_8_ = 0x8000000080000000;
                auVar35._12_4_ = 0x80000000;
                auVar130._16_16_ = local_820._16_16_;
                auVar87 = vxorps_avx512vl(auVar24,auVar35);
                auVar229._0_4_ = fVar263 * auVar82._0_4_ * fVar250;
                auVar229._4_4_ = fVar235 * auVar82._4_4_ * fVar250;
                auVar229._8_4_ = fVar251 * auVar82._8_4_ * fVar250;
                auVar229._12_4_ = fVar236 * auVar82._12_4_ * fVar250;
                auVar274 = ZEXT1664(auVar150);
                auVar82 = vdpps_avx(auVar87,auVar150,0x7f);
                auVar227 = vmaxss_avx(ZEXT416((uint)fVar259),
                                      ZEXT416((uint)(fVar261 * fVar262 * 1.9073486e-06)));
                auVar86 = vdivss_avx512f(ZEXT416((uint)fVar259),auVar86);
                auVar85 = vdpps_avx(local_7c0._0_16_,auVar229,0x7f);
                auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar259),auVar227);
                auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar264 + 1.0)),auVar86,auVar83);
                auVar83 = vdpps_avx(local_790,auVar150,0x7f);
                fVar263 = auVar82._0_4_ + auVar85._0_4_;
                auVar82 = vdpps_avx(local_7c0._0_16_,auVar87,0x7f);
                auVar87 = vmulss_avx512f(auVar89,auVar84);
                auVar84 = vmulss_avx512f(auVar84,auVar84);
                auVar85 = vdpps_avx(local_7c0._0_16_,local_790,0x7f);
                auVar88 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar87._0_4_ * auVar84._0_4_)));
                auVar84 = vfnmadd231ss_fma(auVar82,auVar25,ZEXT416((uint)fVar263));
                auVar87 = vfnmadd231ss_fma(auVar85,auVar25,auVar83);
                auVar82 = vpermilps_avx(local_640._0_16_,0xff);
                fVar249 = fVar249 - auVar82._0_4_;
                auVar82 = vshufps_avx(auVar24,auVar24,0xff);
                auVar85 = vfmsub213ss_fma(auVar84,auVar88,auVar82);
                fVar264 = auVar87._0_4_ * auVar88._0_4_;
                auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar263),ZEXT416((uint)fVar264));
                fVar251 = auVar84._0_4_;
                fVar235 = fVar248 * (auVar85._0_4_ / fVar251);
                auVar241 = ZEXT464((uint)fVar235);
                fVar265 = fVar265 - (fVar248 * (fVar264 / fVar251) -
                                    fVar249 * (auVar83._0_4_ / fVar251));
                auVar266 = ZEXT464((uint)fVar265);
                fVar261 = fVar261 - (fVar249 * (fVar263 / fVar251) - fVar235);
                auVar83 = vandps_avx(auVar25,auVar268);
                if (auVar86._0_4_ <= auVar83._0_4_) {
LAB_01c34426:
                  bVar17 = false;
                }
                else {
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar227._0_4_)),
                                            local_700,ZEXT416(0x36000000));
                  auVar83 = vandps_avx(auVar268,ZEXT416((uint)fVar249));
                  if (auVar85._0_4_ <= auVar83._0_4_) goto LAB_01c34426;
                  fVar261 = fVar261 + (float)local_6f0._0_4_;
                  bVar17 = true;
                  if ((((fVar142 <= fVar261) &&
                       (fVar263 = *(float *)(ray + k * 4 + 0x80), fVar261 <= fVar263)) &&
                      (0.0 <= fVar265)) && (fVar265 <= 1.0)) {
                    auVar130._0_16_ = ZEXT816(0) << 0x20;
                    auVar129._4_28_ = auVar130._4_28_;
                    auVar129._0_4_ = local_7e0._0_4_;
                    auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar129._0_16_);
                    fVar248 = auVar83._0_4_;
                    auVar83 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                    pGVar12 = (context->scene->geometries).items[uVar71].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar248 = fVar248 * 1.5 + auVar83._0_4_ * fVar248 * fVar248 * fVar248;
                      auVar180._0_4_ = local_7c0._0_4_ * fVar248;
                      auVar180._4_4_ = local_7c0._4_4_ * fVar248;
                      auVar180._8_4_ = local_7c0._8_4_ * fVar248;
                      auVar180._12_4_ = local_7c0._12_4_ * fVar248;
                      auVar86 = vfmadd213ps_fma(auVar82,auVar180,auVar24);
                      auVar83 = vshufps_avx(auVar180,auVar180,0xc9);
                      auVar82 = vshufps_avx(auVar24,auVar24,0xc9);
                      auVar181._0_4_ = auVar180._0_4_ * auVar82._0_4_;
                      auVar181._4_4_ = auVar180._4_4_ * auVar82._4_4_;
                      auVar181._8_4_ = auVar180._8_4_ * auVar82._8_4_;
                      auVar181._12_4_ = auVar180._12_4_ * auVar82._12_4_;
                      auVar85 = vfmsub231ps_fma(auVar181,auVar24,auVar83);
                      auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                      auVar82 = vshufps_avx(auVar86,auVar86,0xc9);
                      auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                      auVar152._0_4_ = auVar86._0_4_ * auVar85._0_4_;
                      auVar152._4_4_ = auVar86._4_4_ * auVar85._4_4_;
                      auVar152._8_4_ = auVar86._8_4_ * auVar85._8_4_;
                      auVar152._12_4_ = auVar86._12_4_ * auVar85._12_4_;
                      auVar83 = vfmsub231ps_fma(auVar152,auVar83,auVar82);
                      uVar144 = auVar83._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar261;
                        uVar11 = vextractps_avx(auVar83,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar11;
                        uVar11 = vextractps_avx(auVar83,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar11;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar144;
                        *(float *)(ray + k * 4 + 0xf0) = fVar265;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_8e0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar71;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_5e0 = (RTCHitN  [16])vshufps_avx(auVar83,auVar83,0x55);
                        auStack_5d0 = vshufps_avx(auVar83,auVar83,0xaa);
                        local_5c0 = uVar144;
                        uStack_5bc = uVar144;
                        uStack_5b8 = uVar144;
                        uStack_5b4 = uVar144;
                        local_5b0 = fVar265;
                        fStack_5ac = fVar265;
                        fStack_5a8 = fVar265;
                        fStack_5a4 = fVar265;
                        local_5a0 = ZEXT416(0) << 0x20;
                        local_590 = local_600._0_8_;
                        uStack_588 = local_600._8_8_;
                        local_580 = local_5f0;
                        vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                        uStack_56c = context->user->instID[0];
                        local_570 = uStack_56c;
                        uStack_568 = uStack_56c;
                        uStack_564 = uStack_56c;
                        uStack_560 = context->user->instPrimID[0];
                        uStack_55c = uStack_560;
                        uStack_558 = uStack_560;
                        uStack_554 = uStack_560;
                        *(float *)(ray + k * 4 + 0x80) = fVar261;
                        local_900 = local_610._0_8_;
                        uStack_8f8 = local_610._8_8_;
                        local_890.valid = (int *)&local_900;
                        local_890.geometryUserPtr = pGVar12->userPtr;
                        local_890.context = context->user;
                        local_890.hit = local_5e0;
                        local_890.N = 4;
                        local_890.ray = (RTCRayN *)ray;
                        if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar241 = ZEXT464((uint)fVar235);
                          auVar274 = ZEXT1664(auVar150);
                          auVar278 = ZEXT1664(auVar24);
                          (*pGVar12->intersectionFilterN)(&local_890);
                          auVar266 = ZEXT1664(ZEXT416((uint)fVar265));
                          auVar280 = ZEXT3264(local_820);
                          auVar282 = ZEXT3264(local_8c0);
                          auVar283 = ZEXT3264(local_800);
                          auVar270 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        auVar59._8_8_ = uStack_8f8;
                        auVar59._0_8_ = local_900;
                        uVar78 = vptestmd_avx512vl(auVar59,auVar59);
                        if ((uVar78 & 0xf) != 0) {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar241 = ZEXT1664(auVar241._0_16_);
                            auVar274 = ZEXT1664(auVar274._0_16_);
                            auVar278 = ZEXT1664(auVar278._0_16_);
                            (*p_Var16)(&local_890);
                            auVar266 = ZEXT1664(ZEXT416((uint)fVar265));
                            auVar280 = ZEXT3264(local_820);
                            auVar282 = ZEXT3264(local_8c0);
                            auVar283 = ZEXT3264(local_800);
                            auVar270 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar60._8_8_ = uStack_8f8;
                          auVar60._0_8_ = local_900;
                          uVar78 = vptestmd_avx512vl(auVar60,auVar60);
                          uVar78 = uVar78 & 0xf;
                          bVar74 = (byte)uVar78;
                          if (bVar74 != 0) {
                            iVar3 = *(int *)(local_890.hit + 4);
                            iVar4 = *(int *)(local_890.hit + 8);
                            iVar5 = *(int *)(local_890.hit + 0xc);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0xc0) =
                                 (uint)(bVar74 & 1) * *(int *)local_890.hit |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_890.ray + 0xc0);
                            *(uint *)(local_890.ray + 0xc4) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0xc4);
                            *(uint *)(local_890.ray + 200) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 200);
                            *(uint *)(local_890.ray + 0xcc) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0xcc);
                            iVar3 = *(int *)(local_890.hit + 0x14);
                            iVar4 = *(int *)(local_890.hit + 0x18);
                            iVar5 = *(int *)(local_890.hit + 0x1c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0xd0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_890.hit + 0x10) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_890.ray + 0xd0);
                            *(uint *)(local_890.ray + 0xd4) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0xd4);
                            *(uint *)(local_890.ray + 0xd8) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 0xd8);
                            *(uint *)(local_890.ray + 0xdc) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0xdc);
                            iVar3 = *(int *)(local_890.hit + 0x24);
                            iVar4 = *(int *)(local_890.hit + 0x28);
                            iVar5 = *(int *)(local_890.hit + 0x2c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0xe0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_890.hit + 0x20) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_890.ray + 0xe0);
                            *(uint *)(local_890.ray + 0xe4) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0xe4);
                            *(uint *)(local_890.ray + 0xe8) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 0xe8);
                            *(uint *)(local_890.ray + 0xec) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0xec);
                            iVar3 = *(int *)(local_890.hit + 0x34);
                            iVar4 = *(int *)(local_890.hit + 0x38);
                            iVar5 = *(int *)(local_890.hit + 0x3c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0xf0) =
                                 (uint)(bVar74 & 1) * *(int *)(local_890.hit + 0x30) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_890.ray + 0xf0);
                            *(uint *)(local_890.ray + 0xf4) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0xf4);
                            *(uint *)(local_890.ray + 0xf8) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 0xf8);
                            *(uint *)(local_890.ray + 0xfc) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0xfc);
                            iVar3 = *(int *)(local_890.hit + 0x44);
                            iVar4 = *(int *)(local_890.hit + 0x48);
                            iVar5 = *(int *)(local_890.hit + 0x4c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0x100) =
                                 (uint)(bVar74 & 1) * *(int *)(local_890.hit + 0x40) |
                                 (uint)!(bool)(bVar74 & 1) * *(int *)(local_890.ray + 0x100);
                            *(uint *)(local_890.ray + 0x104) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0x104);
                            *(uint *)(local_890.ray + 0x108) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 0x108);
                            *(uint *)(local_890.ray + 0x10c) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0x10c);
                            auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_890.hit + 0x50));
                            *(undefined1 (*) [16])(local_890.ray + 0x110) = auVar83;
                            auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_890.hit + 0x60));
                            *(undefined1 (*) [16])(local_890.ray + 0x120) = auVar83;
                            auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_890.hit + 0x70));
                            *(undefined1 (*) [16])(local_890.ray + 0x130) = auVar83;
                            auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_890.hit + 0x80));
                            *(undefined1 (*) [16])(local_890.ray + 0x140) = auVar83;
                            goto LAB_01c34429;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar263;
                      }
                    }
                  }
                }
LAB_01c34429:
                bVar77 = lVar76 != 0;
                lVar76 = lVar76 + -1;
              } while ((!bVar17) && (bVar77));
              auVar65._4_4_ = fStack_51c;
              auVar65._0_4_ = local_520;
              auVar65._8_4_ = fStack_518;
              auVar65._12_4_ = fStack_514;
              auVar65._16_4_ = fStack_510;
              auVar65._20_4_ = fStack_50c;
              auVar65._24_4_ = fStack_508;
              auVar65._28_4_ = fStack_504;
              uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar44._4_4_ = uVar144;
              auVar44._0_4_ = uVar144;
              auVar44._8_4_ = uVar144;
              auVar44._12_4_ = uVar144;
              auVar44._16_4_ = uVar144;
              auVar44._20_4_ = uVar144;
              auVar44._24_4_ = uVar144;
              auVar44._28_4_ = uVar144;
              uVar26 = vcmpps_avx512vl(auVar65,auVar44,2);
              bVar70 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar70 & (byte)uVar26;
            } while (bVar70 != 0);
          }
          auVar162._0_4_ = (float)local_540._0_4_ + (float)local_660._0_4_;
          auVar162._4_4_ = (float)local_540._4_4_ + (float)local_660._4_4_;
          auVar162._8_4_ = fStack_538 + fStack_658;
          auVar162._12_4_ = fStack_534 + fStack_654;
          auVar162._16_4_ = fStack_530 + fStack_650;
          auVar162._20_4_ = fStack_52c + fStack_64c;
          auVar162._24_4_ = fStack_528 + fStack_648;
          auVar162._28_4_ = fStack_524 + fStack_644;
          uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar45._4_4_ = uVar144;
          auVar45._0_4_ = uVar144;
          auVar45._8_4_ = uVar144;
          auVar45._12_4_ = uVar144;
          auVar45._16_4_ = uVar144;
          auVar45._20_4_ = uVar144;
          auVar45._24_4_ = uVar144;
          auVar45._28_4_ = uVar144;
          uVar26 = vcmpps_avx512vl(auVar162,auVar45,2);
          bVar74 = (byte)local_8cc | (byte)local_8d4;
          bVar72 = (byte)uVar27 & bVar72 & (byte)uVar26;
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar46._8_4_ = 3;
          auVar46._0_8_ = 0x300000003;
          auVar46._12_4_ = 3;
          auVar46._16_4_ = 3;
          auVar46._20_4_ = 3;
          auVar46._24_4_ = 3;
          auVar46._28_4_ = 3;
          auVar90 = vpblendmd_avx512vl(auVar163,auVar46);
          local_540._0_4_ = (uint)(bVar74 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar74 & 1) * 2;
          bVar17 = (bool)(bVar74 >> 1 & 1);
          local_540._4_4_ = (uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * 2;
          bVar17 = (bool)(bVar74 >> 2 & 1);
          fStack_538 = (float)((uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * 2);
          bVar17 = (bool)(bVar74 >> 3 & 1);
          fStack_534 = (float)((uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * 2);
          bVar17 = (bool)(bVar74 >> 4 & 1);
          fStack_530 = (float)((uint)bVar17 * auVar90._16_4_ | (uint)!bVar17 * 2);
          bVar17 = (bool)(bVar74 >> 5 & 1);
          fStack_52c = (float)((uint)bVar17 * auVar90._20_4_ | (uint)!bVar17 * 2);
          bVar17 = (bool)(bVar74 >> 6 & 1);
          fStack_528 = (float)((uint)bVar17 * auVar90._24_4_ | (uint)!bVar17 * 2);
          fStack_524 = (float)((uint)(bVar74 >> 7) * auVar90._28_4_ | (uint)!(bool)(bVar74 >> 7) * 2
                              );
          uVar26 = vpcmpd_avx512vl(_local_540,local_4a0,2);
          bVar74 = (byte)uVar26 & bVar72;
          if (bVar74 != 0) {
            auVar82 = vminps_avx(local_720._0_16_,local_760._0_16_);
            auVar83 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
            auVar85 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar24 = vminps_avx(auVar82,auVar85);
            auVar82 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar85 = vmaxps_avx(auVar83,auVar82);
            auVar83 = vandps_avx(auVar270._0_16_,auVar24);
            auVar82 = vandps_avx(auVar270._0_16_,auVar85);
            auVar83 = vmaxps_avx(auVar83,auVar82);
            auVar82 = vmovshdup_avx(auVar83);
            auVar82 = vmaxss_avx(auVar82,auVar83);
            auVar83 = vshufpd_avx(auVar83,auVar83,1);
            auVar83 = vmaxss_avx(auVar83,auVar82);
            fVar259 = auVar83._0_4_ * 1.9073486e-06;
            local_700 = vshufps_avx(auVar85,auVar85,0xff);
            _local_680 = _local_460;
            local_520 = (float)local_460._0_4_ + (float)local_660._0_4_;
            fStack_51c = (float)local_460._4_4_ + (float)local_660._4_4_;
            fStack_518 = fStack_458 + fStack_658;
            fStack_514 = fStack_454 + fStack_654;
            fStack_510 = fStack_450 + fStack_650;
            fStack_50c = fStack_44c + fStack_64c;
            fStack_508 = fStack_448 + fStack_648;
            fStack_504 = fStack_444 + fStack_644;
            do {
              auVar164._8_4_ = 0x7f800000;
              auVar164._0_8_ = 0x7f8000007f800000;
              auVar164._12_4_ = 0x7f800000;
              auVar164._16_4_ = 0x7f800000;
              auVar164._20_4_ = 0x7f800000;
              auVar164._24_4_ = 0x7f800000;
              auVar164._28_4_ = 0x7f800000;
              auVar90 = vblendmps_avx512vl(auVar164,_local_680);
              auVar131._0_4_ =
                   (uint)(bVar74 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar74 & 1) * 0x7f800000;
              bVar17 = (bool)(bVar74 >> 1 & 1);
              auVar131._4_4_ = (uint)bVar17 * auVar90._4_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar74 >> 2 & 1);
              auVar131._8_4_ = (uint)bVar17 * auVar90._8_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar74 >> 3 & 1);
              auVar131._12_4_ = (uint)bVar17 * auVar90._12_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar74 >> 4 & 1);
              auVar131._16_4_ = (uint)bVar17 * auVar90._16_4_ | (uint)!bVar17 * 0x7f800000;
              bVar17 = (bool)(bVar74 >> 5 & 1);
              auVar131._20_4_ = (uint)bVar17 * auVar90._20_4_ | (uint)!bVar17 * 0x7f800000;
              auVar131._24_4_ =
                   (uint)(bVar74 >> 6) * auVar90._24_4_ | (uint)!(bool)(bVar74 >> 6) * 0x7f800000;
              auVar131._28_4_ = 0x7f800000;
              auVar90 = vshufps_avx(auVar131,auVar131,0xb1);
              auVar90 = vminps_avx(auVar131,auVar90);
              auVar91 = vshufpd_avx(auVar90,auVar90,5);
              auVar90 = vminps_avx(auVar90,auVar91);
              auVar91 = vpermpd_avx2(auVar90,0x4e);
              auVar90 = vminps_avx(auVar90,auVar91);
              uVar26 = vcmpps_avx512vl(auVar131,auVar90,0);
              bVar68 = (byte)uVar26 & bVar74;
              bVar70 = bVar74;
              if (bVar68 != 0) {
                bVar70 = bVar68;
              }
              iVar2 = 0;
              for (uVar73 = (uint)bVar70; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar2 = iVar2 + 1;
              }
              uVar73 = *(uint *)(local_500 + (uint)(iVar2 << 2));
              fVar261 = *(float *)(local_440 + (uint)(iVar2 << 2));
              fVar262 = local_8c4;
              if ((float)local_7a0._0_4_ < 0.0) {
                fVar262 = sqrtf((float)local_7a0._0_4_);
              }
              auVar266 = ZEXT464(uVar73);
              lVar76 = 4;
              do {
                auVar153._4_4_ = fVar261;
                auVar153._0_4_ = fVar261;
                auVar153._8_4_ = fVar261;
                auVar153._12_4_ = fVar261;
                auVar83 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_790);
                fVar265 = auVar266._0_4_;
                fVar236 = 1.0 - fVar265;
                fVar249 = fVar236 * fVar236 * fVar236;
                fVar263 = fVar265 * fVar265;
                fVar251 = fVar265 * fVar263;
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar249),
                                          ZEXT416((uint)fVar251));
                fVar248 = fVar265 * fVar236;
                auVar227 = ZEXT416((uint)fVar236);
                auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar265 * fVar248 * 6.0)),
                                          ZEXT416((uint)(fVar248 * fVar236)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar85 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar251),
                                          ZEXT416((uint)fVar249));
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * fVar236 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar265 * fVar248)));
                fVar249 = fVar249 * 0.16666667;
                fVar264 = (auVar82._0_4_ + auVar24._0_4_) * 0.16666667;
                fVar235 = (auVar85._0_4_ + auVar86._0_4_) * 0.16666667;
                fVar251 = fVar251 * 0.16666667;
                auVar202._0_4_ = fVar251 * (float)local_780._0_4_;
                auVar202._4_4_ = fVar251 * (float)local_780._4_4_;
                auVar202._8_4_ = fVar251 * fStack_778;
                auVar202._12_4_ = fVar251 * fStack_774;
                auVar230._4_4_ = fVar235;
                auVar230._0_4_ = fVar235;
                auVar230._8_4_ = fVar235;
                auVar230._12_4_ = fVar235;
                auVar82 = vfmadd132ps_fma(auVar230,auVar202,local_740._0_16_);
                auVar203._4_4_ = fVar264;
                auVar203._0_4_ = fVar264;
                auVar203._8_4_ = fVar264;
                auVar203._12_4_ = fVar264;
                auVar82 = vfmadd132ps_fma(auVar203,auVar82,local_760._0_16_);
                auVar182._4_4_ = fVar249;
                auVar182._0_4_ = fVar249;
                auVar182._8_4_ = fVar249;
                auVar182._12_4_ = fVar249;
                auVar82 = vfmadd132ps_fma(auVar182,auVar82,local_720._0_16_);
                local_640._0_16_ = auVar82;
                auVar83 = vsubps_avx(auVar83,auVar82);
                local_7c0._0_16_ = auVar83;
                auVar83 = vdpps_avx(auVar83,auVar83,0x7f);
                auVar82 = auVar266._0_16_;
                local_7e0._0_16_ = auVar83;
                if (auVar83._0_4_ < 0.0) {
                  local_860._0_4_ = fVar263;
                  auVar260._0_4_ = sqrtf(auVar83._0_4_);
                  auVar260._4_60_ = extraout_var_01;
                  auVar83 = auVar260._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  local_860._0_4_ = fVar263;
                }
                auVar24 = vfnmsub213ss_fma(auVar82,auVar82,ZEXT416((uint)(fVar248 * 4.0)));
                auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar248 * 4.0)),auVar227,auVar227);
                fVar263 = fVar236 * -fVar236 * 0.5;
                fVar248 = auVar24._0_4_ * 0.5;
                fVar249 = auVar85._0_4_ * 0.5;
                local_860._0_4_ = (float)local_860._0_4_ * 0.5;
                auVar218._0_4_ = (float)local_860._0_4_ * (float)local_780._0_4_;
                auVar218._4_4_ = (float)local_860._0_4_ * (float)local_780._4_4_;
                auVar218._8_4_ = (float)local_860._0_4_ * fStack_778;
                auVar218._12_4_ = (float)local_860._0_4_ * fStack_774;
                auVar183._4_4_ = fVar249;
                auVar183._0_4_ = fVar249;
                auVar183._8_4_ = fVar249;
                auVar183._12_4_ = fVar249;
                auVar85 = vfmadd132ps_fma(auVar183,auVar218,local_740._0_16_);
                auVar204._4_4_ = fVar248;
                auVar204._0_4_ = fVar248;
                auVar204._8_4_ = fVar248;
                auVar204._12_4_ = fVar248;
                auVar85 = vfmadd132ps_fma(auVar204,auVar85,local_760._0_16_);
                auVar276._4_4_ = fVar263;
                auVar276._0_4_ = fVar263;
                auVar276._8_4_ = fVar263;
                auVar276._12_4_ = fVar263;
                local_860._0_16_ = vfmadd132ps_fma(auVar276,auVar85,local_720._0_16_);
                local_6b0 = vdpps_avx(local_860._0_16_,local_860._0_16_,0x7f);
                auVar58._12_4_ = 0;
                auVar58._0_12_ = ZEXT812(0);
                fVar263 = local_6b0._0_4_;
                auVar85 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar263));
                fVar248 = auVar85._0_4_;
                local_6c0 = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar263));
                auVar85 = vfnmadd213ss_fma(local_6c0,local_6b0,ZEXT416(0x40000000));
                uVar73 = auVar83._0_4_;
                local_6a0 = fVar236;
                fStack_69c = fVar236;
                fStack_698 = fVar236;
                fStack_694 = fVar236;
                if (fVar263 < -fVar263) {
                  auVar209._0_4_ = sqrtf(fVar263);
                  auVar209._4_60_ = extraout_var_02;
                  auVar83 = ZEXT416(uVar73);
                  auVar86 = auVar209._0_16_;
                  auVar24 = local_860._0_16_;
                }
                else {
                  auVar86 = vsqrtss_avx512f(local_6b0,local_6b0);
                  auVar24 = local_860._0_16_;
                }
                fVar263 = fVar248 * 1.5 + fVar263 * -0.5 * fVar248 * fVar248 * fVar248;
                auVar154._0_4_ = auVar24._0_4_ * fVar263;
                auVar154._4_4_ = auVar24._4_4_ * fVar263;
                auVar154._8_4_ = auVar24._8_4_ * fVar263;
                auVar154._12_4_ = auVar24._12_4_ * fVar263;
                auVar25 = vdpps_avx(local_7c0._0_16_,auVar154,0x7f);
                fVar264 = auVar83._0_4_;
                fVar248 = auVar25._0_4_;
                auVar155._0_4_ = fVar248 * fVar248;
                auVar155._4_4_ = auVar25._4_4_ * auVar25._4_4_;
                auVar155._8_4_ = auVar25._8_4_ * auVar25._8_4_;
                auVar155._12_4_ = auVar25._12_4_ * auVar25._12_4_;
                auVar87 = vsubps_avx512vl(local_7e0._0_16_,auVar155);
                fVar249 = auVar87._0_4_;
                auVar184._4_12_ = ZEXT812(0) << 0x20;
                auVar184._0_4_ = fVar249;
                auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar184);
                auVar88 = vmulss_avx512f(auVar84,ZEXT416(0x3fc00000));
                auVar89 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar249 < 0.0) {
                  local_6e0 = fVar263;
                  fStack_6dc = fVar263;
                  fStack_6d8 = fVar263;
                  fStack_6d4 = fVar263;
                  local_6d0 = auVar84;
                  fVar249 = sqrtf(fVar249);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar88 = ZEXT416(auVar88._0_4_);
                  auVar86 = ZEXT416(auVar86._0_4_);
                  auVar83 = ZEXT416(uVar73);
                  auVar24 = local_860._0_16_;
                  auVar84 = local_6d0;
                  fVar263 = local_6e0;
                  fVar235 = fStack_6dc;
                  fVar251 = fStack_6d8;
                  fVar236 = fStack_6d4;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar249 = auVar87._0_4_;
                  fVar235 = fVar263;
                  fVar251 = fVar263;
                  fVar236 = fVar263;
                }
                auVar278 = ZEXT1664(auVar24);
                auVar270 = ZEXT1664(local_7c0._0_16_);
                auVar257._8_4_ = 0x7fffffff;
                auVar257._0_8_ = 0x7fffffff7fffffff;
                auVar257._12_4_ = 0x7fffffff;
                auVar283 = ZEXT3264(local_800);
                auVar282 = ZEXT3264(local_8c0);
                auVar280 = ZEXT3264(local_820);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar227,auVar82);
                auVar82 = vfmadd231ss_fma(auVar227,auVar82,SUB6416(ZEXT464(0xc0000000),0));
                auVar205._0_4_ = fVar265 * (float)local_780._0_4_;
                auVar205._4_4_ = fVar265 * (float)local_780._4_4_;
                auVar205._8_4_ = fVar265 * fStack_778;
                auVar205._12_4_ = fVar265 * fStack_774;
                auVar219._0_4_ = auVar82._0_4_;
                auVar219._4_4_ = auVar219._0_4_;
                auVar219._8_4_ = auVar219._0_4_;
                auVar219._12_4_ = auVar219._0_4_;
                auVar82 = vfmadd132ps_fma(auVar219,auVar205,local_740._0_16_);
                auVar185._0_4_ = auVar87._0_4_;
                auVar185._4_4_ = auVar185._0_4_;
                auVar185._8_4_ = auVar185._0_4_;
                auVar185._12_4_ = auVar185._0_4_;
                auVar82 = vfmadd132ps_fma(auVar185,auVar82,local_760._0_16_);
                auVar64._4_4_ = fStack_69c;
                auVar64._0_4_ = local_6a0;
                auVar64._8_4_ = fStack_698;
                auVar64._12_4_ = fStack_694;
                auVar82 = vfmadd132ps_fma(auVar64,auVar82,local_720._0_16_);
                auVar186._0_4_ = auVar82._0_4_ * (float)local_6b0._0_4_;
                auVar186._4_4_ = auVar82._4_4_ * (float)local_6b0._0_4_;
                auVar186._8_4_ = auVar82._8_4_ * (float)local_6b0._0_4_;
                auVar186._12_4_ = auVar82._12_4_ * (float)local_6b0._0_4_;
                auVar82 = vdpps_avx(auVar24,auVar82,0x7f);
                fVar250 = auVar82._0_4_;
                auVar206._0_4_ = auVar24._0_4_ * fVar250;
                auVar206._4_4_ = auVar24._4_4_ * fVar250;
                auVar206._8_4_ = auVar24._8_4_ * fVar250;
                auVar206._12_4_ = auVar24._12_4_ * fVar250;
                auVar82 = vsubps_avx(auVar186,auVar206);
                fVar250 = auVar85._0_4_ * (float)local_6c0._0_4_;
                auVar36._8_4_ = 0x80000000;
                auVar36._0_8_ = 0x8000000080000000;
                auVar36._12_4_ = 0x80000000;
                auVar133._16_16_ = local_820._16_16_;
                auVar87 = vxorps_avx512vl(auVar24,auVar36);
                auVar231._0_4_ = fVar263 * auVar82._0_4_ * fVar250;
                auVar231._4_4_ = fVar235 * auVar82._4_4_ * fVar250;
                auVar231._8_4_ = fVar251 * auVar82._8_4_ * fVar250;
                auVar231._12_4_ = fVar236 * auVar82._12_4_ * fVar250;
                auVar274 = ZEXT1664(auVar154);
                auVar82 = vdpps_avx(auVar87,auVar154,0x7f);
                auVar227 = vmaxss_avx(ZEXT416((uint)fVar259),
                                      ZEXT416((uint)(fVar261 * fVar262 * 1.9073486e-06)));
                auVar86 = vdivss_avx512f(ZEXT416((uint)fVar259),auVar86);
                auVar85 = vdpps_avx(local_7c0._0_16_,auVar231,0x7f);
                auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)fVar259),auVar227);
                auVar86 = vfmadd213ss_fma(ZEXT416((uint)(fVar264 + 1.0)),auVar86,auVar83);
                auVar83 = vdpps_avx(local_790,auVar154,0x7f);
                fVar263 = auVar82._0_4_ + auVar85._0_4_;
                auVar82 = vdpps_avx(local_7c0._0_16_,auVar87,0x7f);
                auVar87 = vmulss_avx512f(auVar89,auVar84);
                auVar84 = vmulss_avx512f(auVar84,auVar84);
                auVar85 = vdpps_avx(local_7c0._0_16_,local_790,0x7f);
                auVar88 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar87._0_4_ * auVar84._0_4_)));
                auVar84 = vfnmadd231ss_fma(auVar82,auVar25,ZEXT416((uint)fVar263));
                auVar87 = vfnmadd231ss_fma(auVar85,auVar25,auVar83);
                auVar82 = vpermilps_avx(local_640._0_16_,0xff);
                fVar249 = fVar249 - auVar82._0_4_;
                auVar82 = vshufps_avx(auVar24,auVar24,0xff);
                auVar85 = vfmsub213ss_fma(auVar84,auVar88,auVar82);
                fVar264 = auVar87._0_4_ * auVar88._0_4_;
                auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar83._0_4_ * auVar85._0_4_)),
                                          ZEXT416((uint)fVar263),ZEXT416((uint)fVar264));
                fVar251 = auVar84._0_4_;
                fVar235 = fVar248 * (auVar85._0_4_ / fVar251);
                auVar241 = ZEXT464((uint)fVar235);
                fVar265 = fVar265 - (fVar248 * (fVar264 / fVar251) -
                                    fVar249 * (auVar83._0_4_ / fVar251));
                auVar266 = ZEXT464((uint)fVar265);
                fVar261 = fVar261 - (fVar249 * (fVar263 / fVar251) - fVar235);
                auVar83 = vandps_avx(auVar25,auVar257);
                if (auVar86._0_4_ <= auVar83._0_4_) {
LAB_01c34ff5:
                  bVar17 = false;
                }
                else {
                  auVar85 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ + auVar227._0_4_)),
                                            local_700,ZEXT416(0x36000000));
                  auVar83 = vandps_avx(auVar257,ZEXT416((uint)fVar249));
                  if (auVar85._0_4_ <= auVar83._0_4_) goto LAB_01c34ff5;
                  fVar261 = fVar261 + (float)local_6f0._0_4_;
                  bVar17 = true;
                  if ((((fVar142 <= fVar261) &&
                       (fVar263 = *(float *)(ray + k * 4 + 0x80), fVar261 <= fVar263)) &&
                      (0.0 <= fVar265)) && (fVar265 <= 1.0)) {
                    auVar133._0_16_ = ZEXT816(0) << 0x20;
                    auVar132._4_28_ = auVar133._4_28_;
                    auVar132._0_4_ = local_7e0._0_4_;
                    auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar132._0_16_);
                    fVar248 = auVar83._0_4_;
                    auVar83 = vmulss_avx512f(local_7e0._0_16_,ZEXT416(0xbf000000));
                    pGVar12 = (context->scene->geometries).items[uVar71].ptr;
                    if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      fVar248 = fVar248 * 1.5 + auVar83._0_4_ * fVar248 * fVar248 * fVar248;
                      auVar187._0_4_ = local_7c0._0_4_ * fVar248;
                      auVar187._4_4_ = local_7c0._4_4_ * fVar248;
                      auVar187._8_4_ = local_7c0._8_4_ * fVar248;
                      auVar187._12_4_ = local_7c0._12_4_ * fVar248;
                      auVar86 = vfmadd213ps_fma(auVar82,auVar187,auVar24);
                      auVar83 = vshufps_avx(auVar187,auVar187,0xc9);
                      auVar82 = vshufps_avx(auVar24,auVar24,0xc9);
                      auVar188._0_4_ = auVar187._0_4_ * auVar82._0_4_;
                      auVar188._4_4_ = auVar187._4_4_ * auVar82._4_4_;
                      auVar188._8_4_ = auVar187._8_4_ * auVar82._8_4_;
                      auVar188._12_4_ = auVar187._12_4_ * auVar82._12_4_;
                      auVar85 = vfmsub231ps_fma(auVar188,auVar24,auVar83);
                      auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
                      auVar82 = vshufps_avx(auVar86,auVar86,0xc9);
                      auVar85 = vshufps_avx(auVar85,auVar85,0xd2);
                      auVar156._0_4_ = auVar86._0_4_ * auVar85._0_4_;
                      auVar156._4_4_ = auVar86._4_4_ * auVar85._4_4_;
                      auVar156._8_4_ = auVar86._8_4_ * auVar85._8_4_;
                      auVar156._12_4_ = auVar86._12_4_ * auVar85._12_4_;
                      auVar83 = vfmsub231ps_fma(auVar156,auVar83,auVar82);
                      uVar144 = auVar83._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar261;
                        uVar11 = vextractps_avx(auVar83,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar11;
                        uVar11 = vextractps_avx(auVar83,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar11;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = uVar144;
                        *(float *)(ray + k * 4 + 0xf0) = fVar265;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_8e0;
                        *(uint *)(ray + k * 4 + 0x120) = uVar71;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_5e0 = (RTCHitN  [16])vshufps_avx(auVar83,auVar83,0x55);
                        auStack_5d0 = vshufps_avx(auVar83,auVar83,0xaa);
                        local_5c0 = uVar144;
                        uStack_5bc = uVar144;
                        uStack_5b8 = uVar144;
                        uStack_5b4 = uVar144;
                        local_5b0 = fVar265;
                        fStack_5ac = fVar265;
                        fStack_5a8 = fVar265;
                        fStack_5a4 = fVar265;
                        local_5a0 = ZEXT416(0) << 0x20;
                        local_590 = local_600._0_8_;
                        uStack_588 = local_600._8_8_;
                        local_580 = local_5f0;
                        vpcmpeqd_avx2(ZEXT1632(local_5f0),ZEXT1632(local_5f0));
                        uStack_56c = context->user->instID[0];
                        local_570 = uStack_56c;
                        uStack_568 = uStack_56c;
                        uStack_564 = uStack_56c;
                        uStack_560 = context->user->instPrimID[0];
                        uStack_55c = uStack_560;
                        uStack_558 = uStack_560;
                        uStack_554 = uStack_560;
                        *(float *)(ray + k * 4 + 0x80) = fVar261;
                        local_900 = local_610._0_8_;
                        uStack_8f8 = local_610._8_8_;
                        local_890.valid = (int *)&local_900;
                        local_890.geometryUserPtr = pGVar12->userPtr;
                        local_890.context = context->user;
                        local_890.hit = local_5e0;
                        local_890.N = 4;
                        local_890.ray = (RTCRayN *)ray;
                        if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar241 = ZEXT464((uint)fVar235);
                          auVar270 = ZEXT1664(local_7c0._0_16_);
                          auVar274 = ZEXT1664(auVar154);
                          auVar278 = ZEXT1664(auVar24);
                          (*pGVar12->intersectionFilterN)(&local_890);
                          auVar266 = ZEXT1664(ZEXT416((uint)fVar265));
                          auVar280 = ZEXT3264(local_820);
                          auVar282 = ZEXT3264(local_8c0);
                          auVar283 = ZEXT3264(local_800);
                        }
                        auVar61._8_8_ = uStack_8f8;
                        auVar61._0_8_ = local_900;
                        uVar78 = vptestmd_avx512vl(auVar61,auVar61);
                        if ((uVar78 & 0xf) != 0) {
                          p_Var16 = context->args->filter;
                          if ((p_Var16 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar241 = ZEXT1664(auVar241._0_16_);
                            auVar270 = ZEXT1664(auVar270._0_16_);
                            auVar274 = ZEXT1664(auVar274._0_16_);
                            auVar278 = ZEXT1664(auVar278._0_16_);
                            (*p_Var16)(&local_890);
                            auVar266 = ZEXT1664(ZEXT416((uint)fVar265));
                            auVar280 = ZEXT3264(local_820);
                            auVar282 = ZEXT3264(local_8c0);
                            auVar283 = ZEXT3264(local_800);
                          }
                          auVar62._8_8_ = uStack_8f8;
                          auVar62._0_8_ = local_900;
                          uVar78 = vptestmd_avx512vl(auVar62,auVar62);
                          uVar78 = uVar78 & 0xf;
                          bVar70 = (byte)uVar78;
                          if (bVar70 != 0) {
                            iVar3 = *(int *)(local_890.hit + 4);
                            iVar4 = *(int *)(local_890.hit + 8);
                            iVar5 = *(int *)(local_890.hit + 0xc);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0xc0) =
                                 (uint)(bVar70 & 1) * *(int *)local_890.hit |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_890.ray + 0xc0);
                            *(uint *)(local_890.ray + 0xc4) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0xc4);
                            *(uint *)(local_890.ray + 200) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 200);
                            *(uint *)(local_890.ray + 0xcc) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0xcc);
                            iVar3 = *(int *)(local_890.hit + 0x14);
                            iVar4 = *(int *)(local_890.hit + 0x18);
                            iVar5 = *(int *)(local_890.hit + 0x1c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0xd0) =
                                 (uint)(bVar70 & 1) * *(int *)(local_890.hit + 0x10) |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_890.ray + 0xd0);
                            *(uint *)(local_890.ray + 0xd4) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0xd4);
                            *(uint *)(local_890.ray + 0xd8) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 0xd8);
                            *(uint *)(local_890.ray + 0xdc) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0xdc);
                            iVar3 = *(int *)(local_890.hit + 0x24);
                            iVar4 = *(int *)(local_890.hit + 0x28);
                            iVar5 = *(int *)(local_890.hit + 0x2c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0xe0) =
                                 (uint)(bVar70 & 1) * *(int *)(local_890.hit + 0x20) |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_890.ray + 0xe0);
                            *(uint *)(local_890.ray + 0xe4) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0xe4);
                            *(uint *)(local_890.ray + 0xe8) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 0xe8);
                            *(uint *)(local_890.ray + 0xec) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0xec);
                            iVar3 = *(int *)(local_890.hit + 0x34);
                            iVar4 = *(int *)(local_890.hit + 0x38);
                            iVar5 = *(int *)(local_890.hit + 0x3c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0xf0) =
                                 (uint)(bVar70 & 1) * *(int *)(local_890.hit + 0x30) |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_890.ray + 0xf0);
                            *(uint *)(local_890.ray + 0xf4) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0xf4);
                            *(uint *)(local_890.ray + 0xf8) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 0xf8);
                            *(uint *)(local_890.ray + 0xfc) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0xfc);
                            iVar3 = *(int *)(local_890.hit + 0x44);
                            iVar4 = *(int *)(local_890.hit + 0x48);
                            iVar5 = *(int *)(local_890.hit + 0x4c);
                            bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
                            bVar18 = (bool)((byte)(uVar78 >> 2) & 1);
                            bVar19 = SUB81(uVar78 >> 3,0);
                            *(uint *)(local_890.ray + 0x100) =
                                 (uint)(bVar70 & 1) * *(int *)(local_890.hit + 0x40) |
                                 (uint)!(bool)(bVar70 & 1) * *(int *)(local_890.ray + 0x100);
                            *(uint *)(local_890.ray + 0x104) =
                                 (uint)bVar77 * iVar3 |
                                 (uint)!bVar77 * *(int *)(local_890.ray + 0x104);
                            *(uint *)(local_890.ray + 0x108) =
                                 (uint)bVar18 * iVar4 |
                                 (uint)!bVar18 * *(int *)(local_890.ray + 0x108);
                            *(uint *)(local_890.ray + 0x10c) =
                                 (uint)bVar19 * iVar5 |
                                 (uint)!bVar19 * *(int *)(local_890.ray + 0x10c);
                            auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_890.hit + 0x50));
                            *(undefined1 (*) [16])(local_890.ray + 0x110) = auVar83;
                            auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                                          (local_890.hit + 0x60));
                            *(undefined1 (*) [16])(local_890.ray + 0x120) = auVar83;
                            auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_890.hit + 0x70));
                            *(undefined1 (*) [16])(local_890.ray + 0x130) = auVar83;
                            auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])
                                                          (local_890.hit + 0x80));
                            *(undefined1 (*) [16])(local_890.ray + 0x140) = auVar83;
                            goto LAB_01c34ff8;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x80) = fVar263;
                      }
                    }
                  }
                }
LAB_01c34ff8:
                bVar77 = lVar76 != 0;
                lVar76 = lVar76 + -1;
              } while ((!bVar17) && (bVar77));
              auVar66._4_4_ = fStack_51c;
              auVar66._0_4_ = local_520;
              auVar66._8_4_ = fStack_518;
              auVar66._12_4_ = fStack_514;
              auVar66._16_4_ = fStack_510;
              auVar66._20_4_ = fStack_50c;
              auVar66._24_4_ = fStack_508;
              auVar66._28_4_ = fStack_504;
              uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar47._4_4_ = uVar144;
              auVar47._0_4_ = uVar144;
              auVar47._8_4_ = uVar144;
              auVar47._12_4_ = uVar144;
              auVar47._16_4_ = uVar144;
              auVar47._20_4_ = uVar144;
              auVar47._24_4_ = uVar144;
              auVar47._28_4_ = uVar144;
              uVar26 = vcmpps_avx512vl(auVar66,auVar47,2);
              bVar74 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar74 & (byte)uVar26;
            } while (bVar74 != 0);
          }
          uVar27 = vpcmpd_avx512vl(local_4a0,_local_540,1);
          uVar28 = vpcmpd_avx512vl(local_4a0,local_420,1);
          auVar189._0_4_ = (float)local_660._0_4_ + (float)local_1c0._0_4_;
          auVar189._4_4_ = (float)local_660._4_4_ + (float)local_1c0._4_4_;
          auVar189._8_4_ = fStack_658 + fStack_1b8;
          auVar189._12_4_ = fStack_654 + fStack_1b4;
          auVar189._16_4_ = fStack_650 + fStack_1b0;
          auVar189._20_4_ = fStack_64c + fStack_1ac;
          auVar189._24_4_ = fStack_648 + fStack_1a8;
          auVar189._28_4_ = fStack_644 + fStack_1a4;
          uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar208._4_4_ = uVar144;
          auVar208._0_4_ = uVar144;
          auVar208._8_4_ = uVar144;
          auVar208._12_4_ = uVar144;
          auVar208._16_4_ = uVar144;
          auVar208._20_4_ = uVar144;
          auVar208._24_4_ = uVar144;
          auVar208._28_4_ = uVar144;
          uVar26 = vcmpps_avx512vl(auVar189,auVar208,2);
          bVar74 = (byte)local_8d0 & (byte)uVar28 & (byte)uVar26;
          auVar223._0_4_ = (float)local_660._0_4_ + (float)local_460._0_4_;
          auVar223._4_4_ = (float)local_660._4_4_ + (float)local_460._4_4_;
          auVar223._8_4_ = fStack_658 + fStack_458;
          auVar223._12_4_ = fStack_654 + fStack_454;
          auVar223._16_4_ = fStack_650 + fStack_450;
          auVar223._20_4_ = fStack_64c + fStack_44c;
          auVar223._24_4_ = fStack_648 + fStack_448;
          auVar223._28_4_ = fStack_644 + fStack_444;
          uVar26 = vcmpps_avx512vl(auVar223,auVar208,2);
          bVar72 = bVar72 & (byte)uVar27 & (byte)uVar26 | bVar74;
          prim = local_830;
          if (bVar72 == 0) {
            auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar260 = ZEXT3264(_DAT_02020f20);
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar281 = ZEXT3264(auVar90);
          }
          else {
            uVar78 = local_8e8 & 0xffffffff;
            abStack_180[uVar78 * 0x60] = bVar72;
            bVar17 = (bool)(bVar74 >> 1 & 1);
            bVar77 = (bool)(bVar74 >> 2 & 1);
            bVar18 = (bool)(bVar74 >> 3 & 1);
            bVar19 = (bool)(bVar74 >> 4 & 1);
            bVar20 = (bool)(bVar74 >> 5 & 1);
            bVar21 = (bool)(bVar74 >> 6 & 1);
            auStack_160[uVar78 * 0x18] =
                 (uint)(bVar74 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar74 & 1) * local_460._0_4_;
            auStack_160[uVar78 * 0x18 + 1] =
                 (uint)bVar17 * local_1c0._4_4_ | (uint)!bVar17 * local_460._4_4_;
            auStack_160[uVar78 * 0x18 + 2] =
                 (uint)bVar77 * (int)fStack_1b8 | (uint)!bVar77 * (int)fStack_458;
            auStack_160[uVar78 * 0x18 + 3] =
                 (uint)bVar18 * (int)fStack_1b4 | (uint)!bVar18 * (int)fStack_454;
            auStack_160[uVar78 * 0x18 + 4] =
                 (uint)bVar19 * (int)fStack_1b0 | (uint)!bVar19 * (int)fStack_450;
            afStack_140[uVar78 * 0x18 + -3] =
                 (float)((uint)bVar20 * (int)fStack_1ac | (uint)!bVar20 * (int)fStack_44c);
            afStack_140[uVar78 * 0x18 + -2] =
                 (float)((uint)bVar21 * (int)fStack_1a8 | (uint)!bVar21 * (int)fStack_448);
            afStack_140[uVar78 * 0x18 + -1] =
                 (float)((uint)(bVar74 >> 7) * (int)fStack_1a4 |
                        (uint)!(bool)(bVar74 >> 7) * (int)fStack_444);
            uVar26 = vmovlps_avx(local_840);
            *(undefined8 *)(afStack_140 + uVar78 * 0x18) = uVar26;
            auStack_138[uVar78 * 0x18] = (int)local_828 + 1;
            local_8e8 = (ulong)((int)local_8e8 + 1);
            auVar258 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
            auVar260 = ZEXT3264(_DAT_02020f20);
            auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar281 = ZEXT3264(auVar90);
          }
        }
      }
    }
    auVar209 = ZEXT1664(local_840);
    local_8e8 = local_8e8 & 0xffffffff;
    do {
      if ((int)local_8e8 == 0) {
        uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar37._4_4_ = uVar144;
        auVar37._0_4_ = uVar144;
        auVar37._8_4_ = uVar144;
        auVar37._12_4_ = uVar144;
        uVar26 = vcmpps_avx512vl(local_4b0,auVar37,2);
        uVar71 = (uint)uVar26 & (uint)local_688 - 1 & (uint)local_688;
        local_688 = (ulong)uVar71;
        if (uVar71 == 0) {
          return;
        }
        goto LAB_01c32c27;
      }
      uVar78 = (ulong)((int)local_8e8 - 1);
      auVar90 = *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x18);
      auVar190._0_4_ = auVar90._0_4_ + (float)local_660._0_4_;
      auVar190._4_4_ = auVar90._4_4_ + (float)local_660._4_4_;
      auVar190._8_4_ = auVar90._8_4_ + fStack_658;
      auVar190._12_4_ = auVar90._12_4_ + fStack_654;
      auVar190._16_4_ = auVar90._16_4_ + fStack_650;
      auVar190._20_4_ = auVar90._20_4_ + fStack_64c;
      auVar190._24_4_ = auVar90._24_4_ + fStack_648;
      auVar190._28_4_ = auVar90._28_4_ + fStack_644;
      uVar144 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar48._4_4_ = uVar144;
      auVar48._0_4_ = uVar144;
      auVar48._8_4_ = uVar144;
      auVar48._12_4_ = uVar144;
      auVar48._16_4_ = uVar144;
      auVar48._20_4_ = uVar144;
      auVar48._24_4_ = uVar144;
      auVar48._28_4_ = uVar144;
      uVar26 = vcmpps_avx512vl(auVar190,auVar48,2);
      uVar73 = (uint)uVar26 & (uint)abStack_180[uVar78 * 0x60];
      bVar72 = (byte)uVar73;
      if (uVar73 != 0) {
        auVar191._8_4_ = 0x7f800000;
        auVar191._0_8_ = 0x7f8000007f800000;
        auVar191._12_4_ = 0x7f800000;
        auVar191._16_4_ = 0x7f800000;
        auVar191._20_4_ = 0x7f800000;
        auVar191._24_4_ = 0x7f800000;
        auVar191._28_4_ = 0x7f800000;
        auVar91 = vblendmps_avx512vl(auVar191,auVar90);
        auVar134._0_4_ =
             (uint)(bVar72 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar72 & 1) * (int)auVar90._0_4_;
        bVar17 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar17 * auVar91._4_4_ | (uint)!bVar17 * (int)auVar90._4_4_;
        bVar17 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar17 * auVar91._8_4_ | (uint)!bVar17 * (int)auVar90._8_4_;
        bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar17 * auVar91._12_4_ | (uint)!bVar17 * (int)auVar90._12_4_;
        bVar17 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar17 * auVar91._16_4_ | (uint)!bVar17 * (int)auVar90._16_4_;
        bVar17 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar17 * auVar91._20_4_ | (uint)!bVar17 * (int)auVar90._20_4_;
        bVar17 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar17 * auVar91._24_4_ | (uint)!bVar17 * (int)auVar90._24_4_;
        auVar134._28_4_ =
             (uVar73 >> 7) * auVar91._28_4_ | (uint)!SUB41(uVar73 >> 7,0) * (int)auVar90._28_4_;
        auVar90 = vshufps_avx(auVar134,auVar134,0xb1);
        auVar90 = vminps_avx(auVar134,auVar90);
        auVar91 = vshufpd_avx(auVar90,auVar90,5);
        auVar90 = vminps_avx(auVar90,auVar91);
        auVar91 = vpermpd_avx2(auVar90,0x4e);
        auVar90 = vminps_avx(auVar90,auVar91);
        uVar26 = vcmpps_avx512vl(auVar134,auVar90,0);
        bVar74 = (byte)uVar26 & bVar72;
        if (bVar74 != 0) {
          uVar73 = (uint)bVar74;
        }
        fVar259 = afStack_140[uVar78 * 0x18 + 1];
        uVar135 = 0;
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
          uVar135 = uVar135 + 1;
        }
        local_828 = (ulong)auStack_138[uVar78 * 0x18];
        bVar74 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar72;
        abStack_180[uVar78 * 0x60] = bVar74;
        uVar69 = uVar78;
        if (bVar74 != 0) {
          uVar69 = local_8e8;
        }
        fVar261 = afStack_140[uVar78 * 0x18];
        auVar192._4_4_ = fVar261;
        auVar192._0_4_ = fVar261;
        auVar192._8_4_ = fVar261;
        auVar192._12_4_ = fVar261;
        auVar192._16_4_ = fVar261;
        auVar192._20_4_ = fVar261;
        auVar192._24_4_ = fVar261;
        auVar192._28_4_ = fVar261;
        fVar259 = fVar259 - fVar261;
        auVar165._4_4_ = fVar259;
        auVar165._0_4_ = fVar259;
        auVar165._8_4_ = fVar259;
        auVar165._12_4_ = fVar259;
        auVar165._16_4_ = fVar259;
        auVar165._20_4_ = fVar259;
        auVar165._24_4_ = fVar259;
        auVar165._28_4_ = fVar259;
        auVar83 = vfmadd132ps_fma(auVar165,auVar192,auVar260._0_32_);
        _local_5e0 = ZEXT1632(auVar83);
        auVar209 = ZEXT864(*(ulong *)(local_5e0 + (ulong)uVar135 * 4));
        uVar78 = uVar69;
      }
      local_8e8 = uVar78;
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    } while (bVar72 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }